

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiMBIntersectorK<4,16>::
     occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::BezierCurveT,16,8>,embree::avx512::Occluded1KEpilogMU<8,16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  int iVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined8 uVar24;
  long lVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  ulong uVar69;
  RayK<16> *pRVar70;
  byte bVar71;
  ulong uVar72;
  long lVar73;
  ulong uVar74;
  bool bVar75;
  uint uVar76;
  Geometry *geometry;
  long lVar77;
  ulong uVar78;
  float fVar79;
  float fVar80;
  float fVar127;
  float fVar129;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  float fVar128;
  float fVar130;
  float fVar131;
  float fVar132;
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  float fVar133;
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [64];
  undefined1 auVar126 [64];
  undefined4 uVar134;
  undefined8 uVar135;
  vint4 bi_2;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [64];
  float fVar147;
  vint4 bi_1;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  vint4 bi;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  float fVar157;
  float fVar163;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  float fVar164;
  float fVar165;
  float fVar172;
  float fVar173;
  vint4 ai_2;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  float fVar174;
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  vint4 ai_1;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  vint4 ai;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [32];
  undefined1 auVar195 [16];
  undefined1 auVar196 [64];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [64];
  undefined1 auVar201 [64];
  undefined1 auVar202 [64];
  undefined1 auVar203 [64];
  undefined1 auVar204 [64];
  undefined1 auVar205 [64];
  undefined1 auVar206 [64];
  undefined1 auVar207 [64];
  undefined1 auVar208 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CubicBezierCurve<embree::Vec3fx>,_8> bhit;
  vint<16> mask;
  bool local_9f9;
  RTCFilterFunctionNArguments local_9c0;
  undefined1 local_990 [8];
  float fStack_988;
  float fStack_984;
  undefined4 local_980;
  undefined4 uStack_97c;
  undefined8 uStack_978;
  undefined1 local_970 [16];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  float local_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  LinearSpace3fa *local_8b0;
  Primitive *local_8a8;
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  float local_860;
  float fStack_85c;
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_770 [16];
  undefined1 local_760 [16];
  undefined1 local_750 [16];
  undefined1 local_740 [32];
  undefined8 local_720;
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined4 local_700;
  undefined4 uStack_6fc;
  undefined4 uStack_6f8;
  undefined4 uStack_6f4;
  undefined4 uStack_6f0;
  undefined4 uStack_6ec;
  undefined4 uStack_6e8;
  undefined4 uStack_6e4;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined4 local_680;
  int local_67c;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 local_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  byte local_630;
  float local_620 [4];
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [64];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_510 [16];
  undefined1 local_500 [64];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined4 uStack_364;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  PVar6 = prim[1];
  uVar69 = (ulong)(byte)PVar6;
  lVar25 = uVar69 * 0x25;
  fVar165 = *(float *)(prim + lVar25 + 0x12);
  auVar85 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar85 = vinsertps_avx(auVar85,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar84 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar84 = vinsertps_avx(auVar84,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar85 = vsubps_avx(auVar85,*(undefined1 (*) [16])(prim + lVar25 + 6));
  auVar158._0_4_ = fVar165 * auVar85._0_4_;
  auVar158._4_4_ = fVar165 * auVar85._4_4_;
  auVar158._8_4_ = fVar165 * auVar85._8_4_;
  auVar158._12_4_ = fVar165 * auVar85._12_4_;
  auVar85 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 4 + 6)));
  auVar136._0_4_ = fVar165 * auVar84._0_4_;
  auVar136._4_4_ = fVar165 * auVar84._4_4_;
  auVar136._8_4_ = fVar165 * auVar84._8_4_;
  auVar136._12_4_ = fVar165 * auVar84._12_4_;
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar84 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 5 + 6)));
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar86 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 6 + 6)));
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 0xf + 6)));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar69 + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 0x1a + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 0x1b + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 0x1c + 6)));
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar175._4_4_ = auVar136._0_4_;
  auVar175._0_4_ = auVar136._0_4_;
  auVar175._8_4_ = auVar136._0_4_;
  auVar175._12_4_ = auVar136._0_4_;
  auVar87 = vshufps_avx(auVar136,auVar136,0x55);
  auVar88 = vshufps_avx(auVar136,auVar136,0xaa);
  fVar165 = auVar88._0_4_;
  auVar152._0_4_ = fVar165 * auVar86._0_4_;
  fVar147 = auVar88._4_4_;
  auVar152._4_4_ = fVar147 * auVar86._4_4_;
  fVar164 = auVar88._8_4_;
  auVar152._8_4_ = fVar164 * auVar86._8_4_;
  fVar172 = auVar88._12_4_;
  auVar152._12_4_ = fVar172 * auVar86._12_4_;
  auVar148._0_4_ = auVar20._0_4_ * fVar165;
  auVar148._4_4_ = auVar20._4_4_ * fVar147;
  auVar148._8_4_ = auVar20._8_4_ * fVar164;
  auVar148._12_4_ = auVar20._12_4_ * fVar172;
  auVar137._0_4_ = auVar23._0_4_ * fVar165;
  auVar137._4_4_ = auVar23._4_4_ * fVar147;
  auVar137._8_4_ = auVar23._8_4_ * fVar164;
  auVar137._12_4_ = auVar23._12_4_ * fVar172;
  auVar88 = vfmadd231ps_fma(auVar152,auVar87,auVar84);
  auVar27 = vfmadd231ps_fma(auVar148,auVar87,auVar19);
  auVar87 = vfmadd231ps_fma(auVar137,auVar22,auVar87);
  auVar89 = vfmadd231ps_fma(auVar88,auVar175,auVar85);
  auVar27 = vfmadd231ps_fma(auVar27,auVar175,auVar18);
  auVar28 = vfmadd231ps_fma(auVar87,auVar21,auVar175);
  auVar195._4_4_ = auVar158._0_4_;
  auVar195._0_4_ = auVar158._0_4_;
  auVar195._8_4_ = auVar158._0_4_;
  auVar195._12_4_ = auVar158._0_4_;
  auVar87 = vshufps_avx(auVar158,auVar158,0x55);
  auVar88 = vshufps_avx(auVar158,auVar158,0xaa);
  fVar165 = auVar88._0_4_;
  auVar176._0_4_ = fVar165 * auVar86._0_4_;
  fVar147 = auVar88._4_4_;
  auVar176._4_4_ = fVar147 * auVar86._4_4_;
  fVar164 = auVar88._8_4_;
  auVar176._8_4_ = fVar164 * auVar86._8_4_;
  fVar172 = auVar88._12_4_;
  auVar176._12_4_ = fVar172 * auVar86._12_4_;
  auVar166._0_4_ = auVar20._0_4_ * fVar165;
  auVar166._4_4_ = auVar20._4_4_ * fVar147;
  auVar166._8_4_ = auVar20._8_4_ * fVar164;
  auVar166._12_4_ = auVar20._12_4_ * fVar172;
  auVar159._0_4_ = auVar23._0_4_ * fVar165;
  auVar159._4_4_ = auVar23._4_4_ * fVar147;
  auVar159._8_4_ = auVar23._8_4_ * fVar164;
  auVar159._12_4_ = auVar23._12_4_ * fVar172;
  auVar84 = vfmadd231ps_fma(auVar176,auVar87,auVar84);
  auVar86 = vfmadd231ps_fma(auVar166,auVar87,auVar19);
  auVar19 = vfmadd231ps_fma(auVar159,auVar87,auVar22);
  auVar29 = vfmadd231ps_fma(auVar84,auVar195,auVar85);
  auVar136 = vfmadd231ps_fma(auVar86,auVar195,auVar18);
  auVar187._8_4_ = 0x7fffffff;
  auVar187._0_8_ = 0x7fffffff7fffffff;
  auVar187._12_4_ = 0x7fffffff;
  auVar137 = vfmadd231ps_fma(auVar19,auVar195,auVar21);
  auVar85 = vandps_avx(auVar187,auVar89);
  auVar184._8_4_ = 0x219392ef;
  auVar184._0_8_ = 0x219392ef219392ef;
  auVar184._12_4_ = 0x219392ef;
  uVar78 = vcmpps_avx512vl(auVar85,auVar184,1);
  bVar75 = (bool)((byte)uVar78 & 1);
  auVar81._0_4_ = (uint)bVar75 * 0x219392ef | (uint)!bVar75 * auVar89._0_4_;
  bVar75 = (bool)((byte)(uVar78 >> 1) & 1);
  auVar81._4_4_ = (uint)bVar75 * 0x219392ef | (uint)!bVar75 * auVar89._4_4_;
  bVar75 = (bool)((byte)(uVar78 >> 2) & 1);
  auVar81._8_4_ = (uint)bVar75 * 0x219392ef | (uint)!bVar75 * auVar89._8_4_;
  bVar75 = (bool)((byte)(uVar78 >> 3) & 1);
  auVar81._12_4_ = (uint)bVar75 * 0x219392ef | (uint)!bVar75 * auVar89._12_4_;
  auVar85 = vandps_avx(auVar187,auVar27);
  uVar78 = vcmpps_avx512vl(auVar85,auVar184,1);
  bVar75 = (bool)((byte)uVar78 & 1);
  auVar82._0_4_ = (uint)bVar75 * 0x219392ef | (uint)!bVar75 * auVar27._0_4_;
  bVar75 = (bool)((byte)(uVar78 >> 1) & 1);
  auVar82._4_4_ = (uint)bVar75 * 0x219392ef | (uint)!bVar75 * auVar27._4_4_;
  bVar75 = (bool)((byte)(uVar78 >> 2) & 1);
  auVar82._8_4_ = (uint)bVar75 * 0x219392ef | (uint)!bVar75 * auVar27._8_4_;
  bVar75 = (bool)((byte)(uVar78 >> 3) & 1);
  auVar82._12_4_ = (uint)bVar75 * 0x219392ef | (uint)!bVar75 * auVar27._12_4_;
  auVar85 = vandps_avx(auVar187,auVar28);
  uVar78 = vcmpps_avx512vl(auVar85,auVar184,1);
  bVar75 = (bool)((byte)uVar78 & 1);
  auVar83._0_4_ = (uint)bVar75 * 0x219392ef | (uint)!bVar75 * auVar28._0_4_;
  bVar75 = (bool)((byte)(uVar78 >> 1) & 1);
  auVar83._4_4_ = (uint)bVar75 * 0x219392ef | (uint)!bVar75 * auVar28._4_4_;
  bVar75 = (bool)((byte)(uVar78 >> 2) & 1);
  auVar83._8_4_ = (uint)bVar75 * 0x219392ef | (uint)!bVar75 * auVar28._8_4_;
  bVar75 = (bool)((byte)(uVar78 >> 3) & 1);
  auVar83._12_4_ = (uint)bVar75 * 0x219392ef | (uint)!bVar75 * auVar28._12_4_;
  auVar84 = vrcp14ps_avx512vl(auVar81);
  auVar185._8_4_ = 0x3f800000;
  auVar185._0_8_ = &DAT_3f8000003f800000;
  auVar185._12_4_ = 0x3f800000;
  auVar85 = vfnmadd213ps_fma(auVar81,auVar84,auVar185);
  auVar89 = vfmadd132ps_fma(auVar85,auVar84,auVar84);
  auVar84 = vrcp14ps_avx512vl(auVar82);
  auVar85 = vfnmadd213ps_fma(auVar82,auVar84,auVar185);
  auVar28 = vfmadd132ps_fma(auVar85,auVar84,auVar84);
  auVar84 = vrcp14ps_avx512vl(auVar83);
  auVar85 = vfnmadd213ps_fma(auVar83,auVar84,auVar185);
  auVar26 = vfmadd132ps_fma(auVar85,auVar84,auVar84);
  fVar165 = (*(float *)(ray + k * 4 + 0x1c0) - *(float *)(prim + lVar25 + 0x16)) *
            *(float *)(prim + lVar25 + 0x1a);
  auVar182._4_4_ = fVar165;
  auVar182._0_4_ = fVar165;
  auVar182._8_4_ = fVar165;
  auVar182._12_4_ = fVar165;
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar69 * 7 + 6);
  auVar85 = vpmovsxwd_avx(auVar85);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar69 * 0xb + 6);
  auVar84 = vpmovsxwd_avx(auVar84);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar18 = vsubps_avx(auVar84,auVar85);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar69 * 9 + 6);
  auVar84 = vpmovsxwd_avx(auVar86);
  auVar86 = vfmadd213ps_fma(auVar18,auVar182,auVar85);
  auVar85 = vcvtdq2ps_avx(auVar84);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar69 * 0xd + 6);
  auVar84 = vpmovsxwd_avx(auVar18);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,auVar85);
  auVar18 = vfmadd213ps_fma(auVar84,auVar182,auVar85);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar69 * 0x12 + 6);
  auVar85 = vpmovsxwd_avx(auVar19);
  auVar85 = vcvtdq2ps_avx(auVar85);
  uVar78 = (ulong)(uint)((int)(uVar69 * 5) << 2);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar69 * 2 + uVar78 + 6);
  auVar84 = vpmovsxwd_avx(auVar20);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,auVar85);
  auVar19 = vfmadd213ps_fma(auVar84,auVar182,auVar85);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar78 + 6);
  auVar85 = vpmovsxwd_avx(auVar21);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar69 * 0x18 + 6);
  auVar84 = vpmovsxwd_avx(auVar22);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,auVar85);
  auVar20 = vfmadd213ps_fma(auVar84,auVar182,auVar85);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar69 * 0x1d + 6);
  auVar85 = vpmovsxwd_avx(auVar23);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar69 + (ulong)(byte)PVar6 * 0x20 + 6);
  auVar84 = vpmovsxwd_avx(auVar87);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,auVar85);
  auVar21 = vfmadd213ps_fma(auVar84,auVar182,auVar85);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar6 * 0x20 - uVar69) + 6);
  auVar85 = vpmovsxwd_avx(auVar88);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + uVar69 * 0x23 + 6);
  auVar84 = vpmovsxwd_avx(auVar27);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,auVar85);
  auVar84 = vfmadd213ps_fma(auVar84,auVar182,auVar85);
  auVar85 = vsubps_avx(auVar86,auVar29);
  auVar183._0_4_ = auVar89._0_4_ * auVar85._0_4_;
  auVar183._4_4_ = auVar89._4_4_ * auVar85._4_4_;
  auVar183._8_4_ = auVar89._8_4_ * auVar85._8_4_;
  auVar183._12_4_ = auVar89._12_4_ * auVar85._12_4_;
  auVar85 = vsubps_avx(auVar18,auVar29);
  auVar153._0_4_ = auVar89._0_4_ * auVar85._0_4_;
  auVar153._4_4_ = auVar89._4_4_ * auVar85._4_4_;
  auVar153._8_4_ = auVar89._8_4_ * auVar85._8_4_;
  auVar153._12_4_ = auVar89._12_4_ * auVar85._12_4_;
  auVar85 = vsubps_avx(auVar19,auVar136);
  auVar177._0_4_ = auVar28._0_4_ * auVar85._0_4_;
  auVar177._4_4_ = auVar28._4_4_ * auVar85._4_4_;
  auVar177._8_4_ = auVar28._8_4_ * auVar85._8_4_;
  auVar177._12_4_ = auVar28._12_4_ * auVar85._12_4_;
  auVar85 = vsubps_avx(auVar20,auVar136);
  auVar149._0_4_ = auVar28._0_4_ * auVar85._0_4_;
  auVar149._4_4_ = auVar28._4_4_ * auVar85._4_4_;
  auVar149._8_4_ = auVar28._8_4_ * auVar85._8_4_;
  auVar149._12_4_ = auVar28._12_4_ * auVar85._12_4_;
  auVar85 = vsubps_avx(auVar21,auVar137);
  auVar167._0_4_ = auVar26._0_4_ * auVar85._0_4_;
  auVar167._4_4_ = auVar26._4_4_ * auVar85._4_4_;
  auVar167._8_4_ = auVar26._8_4_ * auVar85._8_4_;
  auVar167._12_4_ = auVar26._12_4_ * auVar85._12_4_;
  auVar85 = vsubps_avx(auVar84,auVar137);
  auVar138._0_4_ = auVar26._0_4_ * auVar85._0_4_;
  auVar138._4_4_ = auVar26._4_4_ * auVar85._4_4_;
  auVar138._8_4_ = auVar26._8_4_ * auVar85._8_4_;
  auVar138._12_4_ = auVar26._12_4_ * auVar85._12_4_;
  auVar85 = vpminsd_avx(auVar183,auVar153);
  auVar84 = vpminsd_avx(auVar177,auVar149);
  auVar85 = vmaxps_avx(auVar85,auVar84);
  auVar84 = vpminsd_avx(auVar167,auVar138);
  uVar134 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar89._4_4_ = uVar134;
  auVar89._0_4_ = uVar134;
  auVar89._8_4_ = uVar134;
  auVar89._12_4_ = uVar134;
  auVar84 = vmaxps_avx512vl(auVar84,auVar89);
  auVar85 = vmaxps_avx(auVar85,auVar84);
  auVar28._8_4_ = 0x3f7ffffa;
  auVar28._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar28._12_4_ = 0x3f7ffffa;
  local_510 = vmulps_avx512vl(auVar85,auVar28);
  auVar85 = vpmaxsd_avx(auVar183,auVar153);
  auVar84 = vpmaxsd_avx(auVar177,auVar149);
  auVar85 = vminps_avx(auVar85,auVar84);
  auVar84 = vpmaxsd_avx(auVar167,auVar138);
  uVar134 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar26._4_4_ = uVar134;
  auVar26._0_4_ = uVar134;
  auVar26._8_4_ = uVar134;
  auVar26._12_4_ = uVar134;
  auVar84 = vminps_avx512vl(auVar84,auVar26);
  auVar85 = vminps_avx(auVar85,auVar84);
  auVar29._8_4_ = 0x3f800003;
  auVar29._0_8_ = 0x3f8000033f800003;
  auVar29._12_4_ = 0x3f800003;
  auVar85 = vmulps_avx512vl(auVar85,auVar29);
  auVar84 = vpbroadcastd_avx512vl();
  uVar135 = vcmpps_avx512vl(local_510,auVar85,2);
  uVar78 = vpcmpgtd_avx512vl(auVar84,_DAT_01ff0cf0);
  uVar78 = ((byte)uVar135 & 0xf) & uVar78;
  local_9f9 = (char)uVar78 != '\0';
  if (local_9f9) {
    local_8b0 = pre->ray_space + k;
    auVar146 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_300 = vmovdqa64_avx512f(auVar146);
    local_8a8 = prim;
    do {
      lVar25 = 0;
      for (uVar69 = uVar78; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x8000000000000000) {
        lVar25 = lVar25 + 1;
      }
      uVar76 = *(uint *)(local_8a8 + 2);
      pGVar8 = (context->scene->geometries).items[uVar76].ptr;
      local_440._0_8_ = CONCAT44(0,*(uint *)(local_8a8 + lVar25 * 4 + 6));
      uVar69 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                               CONCAT44(0,*(uint *)(local_8a8 + lVar25 * 4 + 6)) *
                               pGVar8[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar165 = (pGVar8->time_range).lower;
      fVar165 = pGVar8->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0x1c0) - fVar165) /
                ((pGVar8->time_range).upper - fVar165));
      auVar85 = vroundss_avx(ZEXT416((uint)fVar165),ZEXT416((uint)fVar165),9);
      auVar85 = vminss_avx(auVar85,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
      auVar85 = vmaxss_avx(ZEXT816(0) << 0x20,auVar85);
      fVar165 = fVar165 - auVar85._0_4_;
      _Var9 = pGVar8[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar73 = (long)(int)auVar85._0_4_ * 0x38;
      lVar25 = *(long *)(_Var9 + 0x10 + lVar73);
      lVar77 = *(long *)(_Var9 + 0x38 + lVar73);
      lVar10 = *(long *)(_Var9 + 0x48 + lVar73);
      auVar150._4_4_ = fVar165;
      auVar150._0_4_ = fVar165;
      auVar150._8_4_ = fVar165;
      auVar150._12_4_ = fVar165;
      pfVar3 = (float *)(lVar77 + uVar69 * lVar10);
      auVar188._0_4_ = fVar165 * *pfVar3;
      auVar188._4_4_ = fVar165 * pfVar3[1];
      auVar188._8_4_ = fVar165 * pfVar3[2];
      auVar188._12_4_ = fVar165 * pfVar3[3];
      pfVar3 = (float *)(lVar77 + (uVar69 + 1) * lVar10);
      auVar189._0_4_ = fVar165 * *pfVar3;
      auVar189._4_4_ = fVar165 * pfVar3[1];
      auVar189._8_4_ = fVar165 * pfVar3[2];
      auVar189._12_4_ = fVar165 * pfVar3[3];
      auVar85 = vmulps_avx512vl(auVar150,*(undefined1 (*) [16])(lVar77 + (uVar69 + 2) * lVar10));
      auVar84 = vmulps_avx512vl(auVar150,*(undefined1 (*) [16])(lVar77 + lVar10 * (uVar69 + 3)));
      lVar77 = *(long *)(_Var9 + lVar73);
      fVar165 = 1.0 - fVar165;
      auVar139._4_4_ = fVar165;
      auVar139._0_4_ = fVar165;
      auVar139._8_4_ = fVar165;
      auVar139._12_4_ = fVar165;
      local_970 = vfmadd231ps_fma(auVar188,auVar139,*(undefined1 (*) [16])(lVar77 + lVar25 * uVar69)
                                 );
      local_750 = vfmadd231ps_fma(auVar189,auVar139,
                                  *(undefined1 (*) [16])(lVar77 + lVar25 * (uVar69 + 1)));
      local_760 = vfmadd231ps_avx512vl
                            (auVar85,auVar139,*(undefined1 (*) [16])(lVar77 + lVar25 * (uVar69 + 2))
                            );
      local_770 = vfmadd231ps_avx512vl
                            (auVar84,auVar139,*(undefined1 (*) [16])(lVar77 + lVar25 * (uVar69 + 3))
                            );
      iVar7 = (int)pGVar8[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar85 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40))
                              ,0x1c);
      lVar25 = (long)iVar7 * 0x44;
      auVar85 = vinsertps_avx(auVar85,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
      auVar86 = vsubps_avx(local_970,auVar85);
      uVar134 = auVar86._0_4_;
      auVar154._4_4_ = uVar134;
      auVar154._0_4_ = uVar134;
      auVar154._8_4_ = uVar134;
      auVar154._12_4_ = uVar134;
      auVar84 = vshufps_avx(auVar86,auVar86,0x55);
      aVar4 = (local_8b0->vx).field_0;
      aVar5 = (local_8b0->vy).field_0;
      fVar165 = (local_8b0->vz).field_0.m128[0];
      fVar147 = *(float *)((long)&(local_8b0->vz).field_0 + 4);
      fVar164 = *(float *)((long)&(local_8b0->vz).field_0 + 8);
      fVar172 = *(float *)((long)&(local_8b0->vz).field_0 + 0xc);
      auVar86 = vshufps_avx(auVar86,auVar86,0xaa);
      auVar191._0_4_ = fVar165 * auVar86._0_4_;
      auVar191._4_4_ = fVar147 * auVar86._4_4_;
      auVar191._8_4_ = fVar164 * auVar86._8_4_;
      auVar191._12_4_ = fVar172 * auVar86._12_4_;
      auVar84 = vfmadd231ps_fma(auVar191,(undefined1  [16])aVar5,auVar84);
      auVar18 = vfmadd231ps_fma(auVar84,(undefined1  [16])aVar4,auVar154);
      auVar86 = vsubps_avx(local_750,auVar85);
      uVar134 = auVar86._0_4_;
      auVar155._4_4_ = uVar134;
      auVar155._0_4_ = uVar134;
      auVar155._8_4_ = uVar134;
      auVar155._12_4_ = uVar134;
      auVar84 = vshufps_avx(auVar86,auVar86,0x55);
      auVar86 = vshufps_avx(auVar86,auVar86,0xaa);
      auVar192._0_4_ = fVar165 * auVar86._0_4_;
      auVar192._4_4_ = fVar147 * auVar86._4_4_;
      auVar192._8_4_ = fVar164 * auVar86._8_4_;
      auVar192._12_4_ = fVar172 * auVar86._12_4_;
      auVar84 = vfmadd231ps_fma(auVar192,(undefined1  [16])aVar5,auVar84);
      auVar19 = vfmadd231ps_fma(auVar84,(undefined1  [16])aVar4,auVar155);
      auVar86 = vsubps_avx512vl(local_760,auVar85);
      uVar134 = auVar86._0_4_;
      auVar156._4_4_ = uVar134;
      auVar156._0_4_ = uVar134;
      auVar156._8_4_ = uVar134;
      auVar156._12_4_ = uVar134;
      auVar84 = vshufps_avx(auVar86,auVar86,0x55);
      auVar86 = vshufps_avx(auVar86,auVar86,0xaa);
      auVar193._0_4_ = fVar165 * auVar86._0_4_;
      auVar193._4_4_ = fVar147 * auVar86._4_4_;
      auVar193._8_4_ = fVar164 * auVar86._8_4_;
      auVar193._12_4_ = fVar172 * auVar86._12_4_;
      auVar84 = vfmadd231ps_fma(auVar193,(undefined1  [16])aVar5,auVar84);
      auVar86 = vfmadd231ps_fma(auVar84,(undefined1  [16])aVar4,auVar156);
      auVar84 = vsubps_avx512vl(local_770,auVar85);
      uVar134 = auVar84._0_4_;
      auVar151._4_4_ = uVar134;
      auVar151._0_4_ = uVar134;
      auVar151._8_4_ = uVar134;
      auVar151._12_4_ = uVar134;
      auVar85 = vshufps_avx(auVar84,auVar84,0x55);
      auVar84 = vshufps_avx(auVar84,auVar84,0xaa);
      auVar197._0_4_ = fVar165 * auVar84._0_4_;
      auVar197._4_4_ = fVar147 * auVar84._4_4_;
      auVar197._8_4_ = fVar164 * auVar84._8_4_;
      auVar197._12_4_ = fVar172 * auVar84._12_4_;
      auVar85 = vfmadd231ps_fma(auVar197,(undefined1  [16])aVar5,auVar85);
      auVar20 = vfmadd231ps_fma(auVar85,(undefined1  [16])aVar4,auVar151);
      auVar105 = *(undefined1 (*) [32])(bezier_basis0 + lVar25);
      uVar134 = auVar18._0_4_;
      local_7a0._4_4_ = uVar134;
      local_7a0._0_4_ = uVar134;
      local_7a0._8_4_ = uVar134;
      local_7a0._12_4_ = uVar134;
      local_7a0._16_4_ = uVar134;
      local_7a0._20_4_ = uVar134;
      local_7a0._24_4_ = uVar134;
      local_7a0._28_4_ = uVar134;
      auVar107 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x484);
      auVar90._8_4_ = 1;
      auVar90._0_8_ = 0x100000001;
      auVar90._12_4_ = 1;
      auVar90._16_4_ = 1;
      auVar90._20_4_ = 1;
      auVar90._24_4_ = 1;
      auVar90._28_4_ = 1;
      local_740 = vpermps_avx2(auVar90,ZEXT1632(auVar18));
      local_7c0 = vbroadcastss_avx512vl(auVar19);
      local_900 = vpermps_avx512vl(auVar90,ZEXT1632(auVar19));
      auVar103 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x908);
      local_920 = vbroadcastss_avx512vl(auVar86);
      local_800 = vpermps_avx512vl(auVar90,ZEXT1632(auVar86));
      auVar102 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0xd8c);
      local_820 = vbroadcastss_avx512vl(auVar20);
      auVar146 = ZEXT3264(local_820);
      local_840 = vpermps_avx512vl(auVar90,ZEXT1632(auVar20));
      auVar207 = ZEXT3264(local_840);
      auVar90 = vmulps_avx512vl(local_820,auVar102);
      auVar91 = vmulps_avx512vl(local_840,auVar102);
      auVar90 = vfmadd231ps_avx512vl(auVar90,auVar103,local_920);
      auVar91 = vfmadd231ps_avx512vl(auVar91,auVar103,local_800);
      auVar90 = vfmadd231ps_avx512vl(auVar90,auVar107,local_7c0);
      auVar92 = vfmadd231ps_avx512vl(auVar91,auVar107,local_900);
      auVar93 = vfmadd231ps_avx512vl(auVar90,auVar105,local_7a0);
      auVar90 = *(undefined1 (*) [32])(bezier_basis1 + lVar25);
      auVar91 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x484);
      auVar101 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x908);
      auVar94 = vfmadd231ps_avx512vl(auVar92,auVar105,local_740);
      auVar92 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0xd8c);
      auVar95 = vmulps_avx512vl(local_820,auVar92);
      auVar96 = vmulps_avx512vl(local_840,auVar92);
      auVar95 = vfmadd231ps_avx512vl(auVar95,auVar101,local_920);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar101,local_800);
      auVar95 = vfmadd231ps_avx512vl(auVar95,auVar91,local_7c0);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar91,local_900);
      auVar21 = vfmadd231ps_fma(auVar95,auVar90,local_7a0);
      auVar22 = vfmadd231ps_fma(auVar96,auVar90,local_740);
      auVar96 = vsubps_avx512vl(ZEXT1632(auVar21),auVar93);
      auVar97 = vsubps_avx512vl(ZEXT1632(auVar22),auVar94);
      auVar95 = vmulps_avx512vl(auVar94,auVar96);
      auVar98 = vmulps_avx512vl(auVar93,auVar97);
      auVar95 = vsubps_avx512vl(auVar95,auVar98);
      auVar85 = vshufps_avx(local_970,local_970,0xff);
      uVar135 = auVar85._0_8_;
      local_320._8_8_ = uVar135;
      local_320._0_8_ = uVar135;
      local_320._16_8_ = uVar135;
      local_320._24_8_ = uVar135;
      auVar85 = vshufps_avx(local_750,local_750,0xff);
      local_340 = vbroadcastsd_avx512vl(auVar85);
      auVar85 = vshufps_avx512vl(local_760,local_760,0xff);
      local_360 = vbroadcastsd_avx512vl(auVar85);
      auVar85 = vshufps_avx512vl(local_770,local_770,0xff);
      uVar135 = auVar85._0_8_;
      register0x00001248 = uVar135;
      local_380 = uVar135;
      register0x00001250 = uVar135;
      register0x00001258 = uVar135;
      auVar98 = vmulps_avx512vl(_local_380,auVar102);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar103,local_360);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar107,local_340);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar105,local_320);
      auVar99 = vmulps_avx512vl(_local_380,auVar92);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar101,local_360);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar91,local_340);
      auVar23 = vfmadd231ps_fma(auVar99,auVar90,local_320);
      auVar99 = vmulps_avx512vl(auVar97,auVar97);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar96,auVar96);
      auVar100 = vmaxps_avx512vl(auVar98,ZEXT1632(auVar23));
      auVar100 = vmulps_avx512vl(auVar100,auVar100);
      auVar99 = vmulps_avx512vl(auVar100,auVar99);
      auVar95 = vmulps_avx512vl(auVar95,auVar95);
      uVar135 = vcmpps_avx512vl(auVar95,auVar99,2);
      auVar85 = vblendps_avx(auVar18,local_970,8);
      auVar87 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar84 = vandps_avx512vl(auVar85,auVar87);
      auVar85 = vblendps_avx(auVar19,local_750,8);
      auVar85 = vandps_avx512vl(auVar85,auVar87);
      auVar84 = vmaxps_avx(auVar84,auVar85);
      auVar85 = vblendps_avx(auVar86,local_760,8);
      auVar88 = vandps_avx512vl(auVar85,auVar87);
      auVar85 = vblendps_avx(auVar20,local_770,8);
      auVar85 = vandps_avx512vl(auVar85,auVar87);
      auVar85 = vmaxps_avx(auVar88,auVar85);
      auVar85 = vmaxps_avx(auVar84,auVar85);
      auVar84 = vmovshdup_avx(auVar85);
      auVar84 = vmaxss_avx(auVar84,auVar85);
      auVar85 = vshufpd_avx(auVar85,auVar85,1);
      auVar85 = vmaxss_avx(auVar85,auVar84);
      auVar84 = vcvtsi2ss_avx512f(local_760,iVar7);
      local_480._0_16_ = auVar84;
      auVar99._0_4_ = auVar84._0_4_;
      auVar99._4_4_ = auVar99._0_4_;
      auVar99._8_4_ = auVar99._0_4_;
      auVar99._12_4_ = auVar99._0_4_;
      auVar99._16_4_ = auVar99._0_4_;
      auVar99._20_4_ = auVar99._0_4_;
      auVar99._24_4_ = auVar99._0_4_;
      auVar99._28_4_ = auVar99._0_4_;
      uVar24 = vcmpps_avx512vl(auVar99,_DAT_02020f40,0xe);
      local_630 = (byte)uVar135 & (byte)uVar24;
      fVar147 = auVar85._0_4_ * 4.7683716e-07;
      auVar95._8_4_ = 2;
      auVar95._0_8_ = 0x200000002;
      auVar95._12_4_ = 2;
      auVar95._16_4_ = 2;
      auVar95._20_4_ = 2;
      auVar95._24_4_ = 2;
      auVar95._28_4_ = 2;
      local_3a0 = vpermps_avx512vl(auVar95,ZEXT1632(auVar18));
      local_3c0 = vpermps_avx512vl(auVar95,ZEXT1632(auVar19));
      local_3e0 = vpermps_avx512vl(auVar95,ZEXT1632(auVar86));
      auVar95 = vpermps_avx2(auVar95,ZEXT1632(auVar20));
      fVar165 = *(float *)(ray + k * 4 + 0xc0);
      auVar85 = auVar97._0_16_;
      _local_990 = ZEXT416((uint)fVar147);
      if (local_630 == 0) {
        bVar75 = false;
        auVar85 = vxorps_avx512vl(auVar85,auVar85);
        auVar205 = ZEXT1664(auVar85);
        auVar202 = ZEXT3264(local_7a0);
        auVar203 = ZEXT3264(local_740);
        auVar204 = ZEXT3264(local_7c0);
        auVar201 = ZEXT3264(local_900);
        auVar208 = ZEXT3264(local_920);
        auVar206 = ZEXT3264(local_800);
      }
      else {
        fStack_85c = 0.0;
        fStack_858 = 0.0;
        fStack_854 = 0.0;
        auVar92 = vmulps_avx512vl(auVar95,auVar92);
        auVar101 = vfmadd213ps_avx512vl(auVar101,local_3e0,auVar92);
        auVar91 = vfmadd213ps_avx512vl(auVar91,local_3c0,auVar101);
        auVar100 = vfmadd213ps_avx512vl(auVar90,local_3a0,auVar91);
        auVar102 = vmulps_avx512vl(auVar95,auVar102);
        auVar103 = vfmadd213ps_avx512vl(auVar103,local_3e0,auVar102);
        auVar91 = vfmadd213ps_avx512vl(auVar107,local_3c0,auVar103);
        auVar107 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x1210);
        auVar103 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x1694);
        auVar102 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x1b18);
        auVar90 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x1f9c);
        auVar104 = vfmadd213ps_avx512vl(auVar105,local_3a0,auVar91);
        auVar105 = vmulps_avx512vl(local_820,auVar90);
        auVar91 = vmulps_avx512vl(local_840,auVar90);
        auVar194._0_4_ = auVar95._0_4_ * auVar90._0_4_;
        auVar194._4_4_ = auVar95._4_4_ * auVar90._4_4_;
        auVar194._8_4_ = auVar95._8_4_ * auVar90._8_4_;
        auVar194._12_4_ = auVar95._12_4_ * auVar90._12_4_;
        auVar194._16_4_ = auVar95._16_4_ * auVar90._16_4_;
        auVar194._20_4_ = auVar95._20_4_ * auVar90._20_4_;
        auVar194._24_4_ = auVar95._24_4_ * auVar90._24_4_;
        auVar194._28_4_ = 0;
        auVar208 = ZEXT3264(local_920);
        auVar105 = vfmadd231ps_avx512vl(auVar105,auVar102,local_920);
        auVar90 = vfmadd231ps_avx512vl(auVar91,auVar102,local_800);
        auVar102 = vfmadd231ps_avx512vl(auVar194,local_3e0,auVar102);
        auVar105 = vfmadd231ps_avx512vl(auVar105,auVar103,local_7c0);
        auVar90 = vfmadd231ps_avx512vl(auVar90,auVar103,local_900);
        auVar91 = vfmadd231ps_avx512vl(auVar102,local_3c0,auVar103);
        auVar101 = vfmadd231ps_avx512vl(auVar105,auVar107,local_7a0);
        auVar90 = vfmadd231ps_avx512vl(auVar90,auVar107,local_740);
        auVar105 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x1210);
        auVar103 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x1b18);
        auVar102 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x1f9c);
        auVar91 = vfmadd231ps_avx512vl(auVar91,local_3a0,auVar107);
        auVar92 = vmulps_avx512vl(local_820,auVar102);
        auVar106 = vmulps_avx512vl(local_840,auVar102);
        auVar107._4_4_ = auVar95._4_4_ * auVar102._4_4_;
        auVar107._0_4_ = auVar95._0_4_ * auVar102._0_4_;
        auVar107._8_4_ = auVar95._8_4_ * auVar102._8_4_;
        auVar107._12_4_ = auVar95._12_4_ * auVar102._12_4_;
        auVar107._16_4_ = auVar95._16_4_ * auVar102._16_4_;
        auVar107._20_4_ = auVar95._20_4_ * auVar102._20_4_;
        auVar107._24_4_ = auVar95._24_4_ * auVar102._24_4_;
        auVar107._28_4_ = auVar102._28_4_;
        auVar102 = vfmadd231ps_avx512vl(auVar92,auVar103,local_920);
        auVar92 = vfmadd231ps_avx512vl(auVar106,auVar103,local_800);
        auVar103 = vfmadd231ps_avx512vl(auVar107,local_3e0,auVar103);
        auVar107 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x1694);
        auVar102 = vfmadd231ps_avx512vl(auVar102,auVar107,local_7c0);
        auVar92 = vfmadd231ps_avx512vl(auVar92,auVar107,local_900);
        auVar107 = vfmadd231ps_avx512vl(auVar103,local_3c0,auVar107);
        auVar103 = vfmadd231ps_avx512vl(auVar102,auVar105,local_7a0);
        auVar102 = vfmadd231ps_avx512vl(auVar92,auVar105,local_740);
        auVar92 = vfmadd231ps_avx512vl(auVar107,local_3a0,auVar105);
        auVar198._8_4_ = 0x7fffffff;
        auVar198._0_8_ = 0x7fffffff7fffffff;
        auVar198._12_4_ = 0x7fffffff;
        auVar198._16_4_ = 0x7fffffff;
        auVar198._20_4_ = 0x7fffffff;
        auVar198._24_4_ = 0x7fffffff;
        auVar198._28_4_ = 0x7fffffff;
        auVar105 = vandps_avx(auVar101,auVar198);
        auVar107 = vandps_avx(auVar90,auVar198);
        auVar107 = vmaxps_avx(auVar105,auVar107);
        auVar105 = vandps_avx(auVar91,auVar198);
        auVar105 = vmaxps_avx(auVar107,auVar105);
        auVar91 = vbroadcastss_avx512vl(_local_990);
        uVar69 = vcmpps_avx512vl(auVar105,auVar91,1);
        bVar75 = (bool)((byte)uVar69 & 1);
        auVar106._0_4_ = (float)((uint)bVar75 * auVar96._0_4_ | (uint)!bVar75 * auVar101._0_4_);
        bVar75 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar106._4_4_ = (float)((uint)bVar75 * auVar96._4_4_ | (uint)!bVar75 * auVar101._4_4_);
        bVar75 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar106._8_4_ = (float)((uint)bVar75 * auVar96._8_4_ | (uint)!bVar75 * auVar101._8_4_);
        bVar75 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar106._12_4_ = (float)((uint)bVar75 * auVar96._12_4_ | (uint)!bVar75 * auVar101._12_4_);
        bVar75 = (bool)((byte)(uVar69 >> 4) & 1);
        auVar106._16_4_ = (float)((uint)bVar75 * auVar96._16_4_ | (uint)!bVar75 * auVar101._16_4_);
        bVar75 = (bool)((byte)(uVar69 >> 5) & 1);
        auVar106._20_4_ = (float)((uint)bVar75 * auVar96._20_4_ | (uint)!bVar75 * auVar101._20_4_);
        bVar75 = (bool)((byte)(uVar69 >> 6) & 1);
        auVar106._24_4_ = (float)((uint)bVar75 * auVar96._24_4_ | (uint)!bVar75 * auVar101._24_4_);
        bVar75 = SUB81(uVar69 >> 7,0);
        auVar106._28_4_ = (uint)bVar75 * auVar96._28_4_ | (uint)!bVar75 * auVar101._28_4_;
        bVar75 = (bool)((byte)uVar69 & 1);
        auVar108._0_4_ = (float)((uint)bVar75 * auVar97._0_4_ | (uint)!bVar75 * auVar90._0_4_);
        bVar75 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar108._4_4_ = (float)((uint)bVar75 * auVar97._4_4_ | (uint)!bVar75 * auVar90._4_4_);
        bVar75 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar108._8_4_ = (float)((uint)bVar75 * auVar97._8_4_ | (uint)!bVar75 * auVar90._8_4_);
        bVar75 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar108._12_4_ = (float)((uint)bVar75 * auVar97._12_4_ | (uint)!bVar75 * auVar90._12_4_);
        bVar75 = (bool)((byte)(uVar69 >> 4) & 1);
        auVar108._16_4_ = (float)((uint)bVar75 * auVar97._16_4_ | (uint)!bVar75 * auVar90._16_4_);
        bVar75 = (bool)((byte)(uVar69 >> 5) & 1);
        auVar108._20_4_ = (float)((uint)bVar75 * auVar97._20_4_ | (uint)!bVar75 * auVar90._20_4_);
        bVar75 = (bool)((byte)(uVar69 >> 6) & 1);
        auVar108._24_4_ = (float)((uint)bVar75 * auVar97._24_4_ | (uint)!bVar75 * auVar90._24_4_);
        bVar75 = SUB81(uVar69 >> 7,0);
        auVar108._28_4_ = (uint)bVar75 * auVar97._28_4_ | (uint)!bVar75 * auVar90._28_4_;
        auVar105 = vandps_avx(auVar198,auVar103);
        auVar107 = vandps_avx(auVar102,auVar198);
        auVar107 = vmaxps_avx(auVar105,auVar107);
        auVar105 = vandps_avx(auVar92,auVar198);
        auVar105 = vmaxps_avx(auVar107,auVar105);
        uVar69 = vcmpps_avx512vl(auVar105,auVar91,1);
        bVar75 = (bool)((byte)uVar69 & 1);
        auVar109._0_4_ = (float)((uint)bVar75 * auVar96._0_4_ | (uint)!bVar75 * auVar103._0_4_);
        bVar75 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar109._4_4_ = (float)((uint)bVar75 * auVar96._4_4_ | (uint)!bVar75 * auVar103._4_4_);
        bVar75 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar109._8_4_ = (float)((uint)bVar75 * auVar96._8_4_ | (uint)!bVar75 * auVar103._8_4_);
        bVar75 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar109._12_4_ = (float)((uint)bVar75 * auVar96._12_4_ | (uint)!bVar75 * auVar103._12_4_);
        bVar75 = (bool)((byte)(uVar69 >> 4) & 1);
        auVar109._16_4_ = (float)((uint)bVar75 * auVar96._16_4_ | (uint)!bVar75 * auVar103._16_4_);
        bVar75 = (bool)((byte)(uVar69 >> 5) & 1);
        auVar109._20_4_ = (float)((uint)bVar75 * auVar96._20_4_ | (uint)!bVar75 * auVar103._20_4_);
        bVar75 = (bool)((byte)(uVar69 >> 6) & 1);
        auVar109._24_4_ = (float)((uint)bVar75 * auVar96._24_4_ | (uint)!bVar75 * auVar103._24_4_);
        bVar75 = SUB81(uVar69 >> 7,0);
        auVar109._28_4_ = (uint)bVar75 * auVar96._28_4_ | (uint)!bVar75 * auVar103._28_4_;
        bVar75 = (bool)((byte)uVar69 & 1);
        auVar110._0_4_ = (float)((uint)bVar75 * auVar97._0_4_ | (uint)!bVar75 * auVar102._0_4_);
        bVar75 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar110._4_4_ = (float)((uint)bVar75 * auVar97._4_4_ | (uint)!bVar75 * auVar102._4_4_);
        bVar75 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar110._8_4_ = (float)((uint)bVar75 * auVar97._8_4_ | (uint)!bVar75 * auVar102._8_4_);
        bVar75 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar110._12_4_ = (float)((uint)bVar75 * auVar97._12_4_ | (uint)!bVar75 * auVar102._12_4_);
        bVar75 = (bool)((byte)(uVar69 >> 4) & 1);
        auVar110._16_4_ = (float)((uint)bVar75 * auVar97._16_4_ | (uint)!bVar75 * auVar102._16_4_);
        bVar75 = (bool)((byte)(uVar69 >> 5) & 1);
        auVar110._20_4_ = (float)((uint)bVar75 * auVar97._20_4_ | (uint)!bVar75 * auVar102._20_4_);
        bVar75 = (bool)((byte)(uVar69 >> 6) & 1);
        auVar110._24_4_ = (float)((uint)bVar75 * auVar97._24_4_ | (uint)!bVar75 * auVar102._24_4_);
        bVar75 = SUB81(uVar69 >> 7,0);
        auVar110._28_4_ = (uint)bVar75 * auVar97._28_4_ | (uint)!bVar75 * auVar102._28_4_;
        auVar89 = vxorps_avx512vl(auVar85,auVar85);
        auVar205 = ZEXT1664(auVar89);
        auVar105 = vfmadd213ps_avx512vl(auVar106,auVar106,ZEXT1632(auVar89));
        auVar85 = vfmadd231ps_fma(auVar105,auVar108,auVar108);
        auVar107 = vrsqrt14ps_avx512vl(ZEXT1632(auVar85));
        fVar164 = auVar107._0_4_;
        fVar172 = auVar107._4_4_;
        fVar173 = auVar107._8_4_;
        fVar174 = auVar107._12_4_;
        fVar157 = auVar107._16_4_;
        fVar163 = auVar107._20_4_;
        fVar79 = auVar107._24_4_;
        auVar105._4_4_ = fVar172 * fVar172 * fVar172 * auVar85._4_4_ * -0.5;
        auVar105._0_4_ = fVar164 * fVar164 * fVar164 * auVar85._0_4_ * -0.5;
        auVar105._8_4_ = fVar173 * fVar173 * fVar173 * auVar85._8_4_ * -0.5;
        auVar105._12_4_ = fVar174 * fVar174 * fVar174 * auVar85._12_4_ * -0.5;
        auVar105._16_4_ = fVar157 * fVar157 * fVar157 * -0.0;
        auVar105._20_4_ = fVar163 * fVar163 * fVar163 * -0.0;
        auVar105._24_4_ = fVar79 * fVar79 * fVar79 * -0.0;
        auVar105._28_4_ = auVar92._28_4_;
        auVar90 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar105 = vfmadd231ps_avx512vl(auVar105,auVar90,auVar107);
        auVar103._4_4_ = auVar108._4_4_ * auVar105._4_4_;
        auVar103._0_4_ = auVar108._0_4_ * auVar105._0_4_;
        auVar103._8_4_ = auVar108._8_4_ * auVar105._8_4_;
        auVar103._12_4_ = auVar108._12_4_ * auVar105._12_4_;
        auVar103._16_4_ = auVar108._16_4_ * auVar105._16_4_;
        auVar103._20_4_ = auVar108._20_4_ * auVar105._20_4_;
        auVar103._24_4_ = auVar108._24_4_ * auVar105._24_4_;
        auVar103._28_4_ = 0;
        auVar102._4_4_ = auVar105._4_4_ * -auVar106._4_4_;
        auVar102._0_4_ = auVar105._0_4_ * -auVar106._0_4_;
        auVar102._8_4_ = auVar105._8_4_ * -auVar106._8_4_;
        auVar102._12_4_ = auVar105._12_4_ * -auVar106._12_4_;
        auVar102._16_4_ = auVar105._16_4_ * -auVar106._16_4_;
        auVar102._20_4_ = auVar105._20_4_ * -auVar106._20_4_;
        auVar102._24_4_ = auVar105._24_4_ * -auVar106._24_4_;
        auVar102._28_4_ = auVar108._28_4_;
        auVar105 = vmulps_avx512vl(auVar105,ZEXT1632(auVar89));
        auVar96 = ZEXT1632(auVar89);
        auVar107 = vfmadd213ps_avx512vl(auVar109,auVar109,auVar96);
        auVar85 = vfmadd231ps_fma(auVar107,auVar110,auVar110);
        auVar107 = vrsqrt14ps_avx512vl(ZEXT1632(auVar85));
        fVar164 = auVar107._0_4_;
        fVar172 = auVar107._4_4_;
        fVar173 = auVar107._8_4_;
        fVar174 = auVar107._12_4_;
        fVar157 = auVar107._16_4_;
        fVar163 = auVar107._20_4_;
        fVar79 = auVar107._24_4_;
        auVar91._4_4_ = fVar172 * fVar172 * fVar172 * auVar85._4_4_ * -0.5;
        auVar91._0_4_ = fVar164 * fVar164 * fVar164 * auVar85._0_4_ * -0.5;
        auVar91._8_4_ = fVar173 * fVar173 * fVar173 * auVar85._8_4_ * -0.5;
        auVar91._12_4_ = fVar174 * fVar174 * fVar174 * auVar85._12_4_ * -0.5;
        auVar91._16_4_ = fVar157 * fVar157 * fVar157 * -0.0;
        auVar91._20_4_ = fVar163 * fVar163 * fVar163 * -0.0;
        auVar91._24_4_ = fVar79 * fVar79 * fVar79 * -0.0;
        auVar91._28_4_ = 0;
        auVar90 = vfmadd231ps_avx512vl(auVar91,auVar90,auVar107);
        auVar101._4_4_ = auVar110._4_4_ * auVar90._4_4_;
        auVar101._0_4_ = auVar110._0_4_ * auVar90._0_4_;
        auVar101._8_4_ = auVar110._8_4_ * auVar90._8_4_;
        auVar101._12_4_ = auVar110._12_4_ * auVar90._12_4_;
        auVar101._16_4_ = auVar110._16_4_ * auVar90._16_4_;
        auVar101._20_4_ = auVar110._20_4_ * auVar90._20_4_;
        auVar101._24_4_ = auVar110._24_4_ * auVar90._24_4_;
        auVar101._28_4_ = auVar107._28_4_;
        auVar92._4_4_ = -auVar109._4_4_ * auVar90._4_4_;
        auVar92._0_4_ = -auVar109._0_4_ * auVar90._0_4_;
        auVar92._8_4_ = -auVar109._8_4_ * auVar90._8_4_;
        auVar92._12_4_ = -auVar109._12_4_ * auVar90._12_4_;
        auVar92._16_4_ = -auVar109._16_4_ * auVar90._16_4_;
        auVar92._20_4_ = -auVar109._20_4_ * auVar90._20_4_;
        auVar92._24_4_ = -auVar109._24_4_ * auVar90._24_4_;
        auVar92._28_4_ = auVar109._28_4_ ^ 0x80000000;
        auVar107 = vmulps_avx512vl(auVar90,auVar96);
        auVar85 = vfmadd213ps_fma(auVar103,auVar98,auVar93);
        auVar84 = vfmadd213ps_fma(auVar102,auVar98,auVar94);
        auVar90 = vfmadd213ps_avx512vl(auVar105,auVar98,auVar104);
        auVar91 = vfmadd213ps_avx512vl(auVar101,ZEXT1632(auVar23),ZEXT1632(auVar21));
        auVar87 = vfnmadd213ps_fma(auVar103,auVar98,auVar93);
        auVar93 = ZEXT1632(auVar23);
        auVar86 = vfmadd213ps_fma(auVar92,auVar93,ZEXT1632(auVar22));
        auVar88 = vfnmadd213ps_fma(auVar102,auVar98,auVar94);
        auVar18 = vfmadd213ps_fma(auVar107,auVar93,auVar100);
        auVar103 = vfnmadd231ps_avx512vl(auVar104,auVar98,auVar105);
        auVar21 = vfnmadd213ps_fma(auVar101,auVar93,ZEXT1632(auVar21));
        auVar22 = vfnmadd213ps_fma(auVar92,auVar93,ZEXT1632(auVar22));
        auVar27 = vfnmadd231ps_fma(auVar100,ZEXT1632(auVar23),auVar107);
        auVar107 = vsubps_avx512vl(auVar91,ZEXT1632(auVar87));
        auVar105 = vsubps_avx(ZEXT1632(auVar86),ZEXT1632(auVar88));
        auVar102 = vsubps_avx512vl(ZEXT1632(auVar18),auVar103);
        auVar101 = vmulps_avx512vl(auVar105,auVar103);
        auVar19 = vfmsub231ps_fma(auVar101,ZEXT1632(auVar88),auVar102);
        auVar93._4_4_ = auVar87._4_4_ * auVar102._4_4_;
        auVar93._0_4_ = auVar87._0_4_ * auVar102._0_4_;
        auVar93._8_4_ = auVar87._8_4_ * auVar102._8_4_;
        auVar93._12_4_ = auVar87._12_4_ * auVar102._12_4_;
        auVar93._16_4_ = auVar102._16_4_ * 0.0;
        auVar93._20_4_ = auVar102._20_4_ * 0.0;
        auVar93._24_4_ = auVar102._24_4_ * 0.0;
        auVar93._28_4_ = auVar102._28_4_;
        auVar102 = vfmsub231ps_avx512vl(auVar93,auVar103,auVar107);
        auVar94._4_4_ = auVar88._4_4_ * auVar107._4_4_;
        auVar94._0_4_ = auVar88._0_4_ * auVar107._0_4_;
        auVar94._8_4_ = auVar88._8_4_ * auVar107._8_4_;
        auVar94._12_4_ = auVar88._12_4_ * auVar107._12_4_;
        auVar94._16_4_ = auVar107._16_4_ * 0.0;
        auVar94._20_4_ = auVar107._20_4_ * 0.0;
        auVar94._24_4_ = auVar107._24_4_ * 0.0;
        auVar94._28_4_ = auVar107._28_4_;
        auVar20 = vfmsub231ps_fma(auVar94,ZEXT1632(auVar87),auVar105);
        auVar105 = vfmadd231ps_avx512vl(ZEXT1632(auVar20),auVar96,auVar102);
        auVar105 = vfmadd231ps_avx512vl(auVar105,auVar96,ZEXT1632(auVar19));
        auVar106 = ZEXT1632(auVar89);
        uVar69 = vcmpps_avx512vl(auVar105,auVar106,2);
        bVar71 = (byte)uVar69;
        fVar79 = (float)((uint)(bVar71 & 1) * auVar85._0_4_ |
                        (uint)!(bool)(bVar71 & 1) * auVar21._0_4_);
        bVar75 = (bool)((byte)(uVar69 >> 1) & 1);
        fVar127 = (float)((uint)bVar75 * auVar85._4_4_ | (uint)!bVar75 * auVar21._4_4_);
        bVar75 = (bool)((byte)(uVar69 >> 2) & 1);
        fVar129 = (float)((uint)bVar75 * auVar85._8_4_ | (uint)!bVar75 * auVar21._8_4_);
        bVar75 = (bool)((byte)(uVar69 >> 3) & 1);
        fVar131 = (float)((uint)bVar75 * auVar85._12_4_ | (uint)!bVar75 * auVar21._12_4_);
        auVar101 = ZEXT1632(CONCAT412(fVar131,CONCAT48(fVar129,CONCAT44(fVar127,fVar79))));
        fVar80 = (float)((uint)(bVar71 & 1) * auVar84._0_4_ |
                        (uint)!(bool)(bVar71 & 1) * auVar22._0_4_);
        bVar75 = (bool)((byte)(uVar69 >> 1) & 1);
        fVar128 = (float)((uint)bVar75 * auVar84._4_4_ | (uint)!bVar75 * auVar22._4_4_);
        bVar75 = (bool)((byte)(uVar69 >> 2) & 1);
        fVar130 = (float)((uint)bVar75 * auVar84._8_4_ | (uint)!bVar75 * auVar22._8_4_);
        bVar75 = (bool)((byte)(uVar69 >> 3) & 1);
        fVar132 = (float)((uint)bVar75 * auVar84._12_4_ | (uint)!bVar75 * auVar22._12_4_);
        auVar92 = ZEXT1632(CONCAT412(fVar132,CONCAT48(fVar130,CONCAT44(fVar128,fVar80))));
        auVar104._0_4_ =
             (float)((uint)(bVar71 & 1) * auVar90._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar27._0_4_)
        ;
        bVar75 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar104._4_4_ = (float)((uint)bVar75 * auVar90._4_4_ | (uint)!bVar75 * auVar27._4_4_);
        bVar75 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar104._8_4_ = (float)((uint)bVar75 * auVar90._8_4_ | (uint)!bVar75 * auVar27._8_4_);
        bVar75 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar104._12_4_ = (float)((uint)bVar75 * auVar90._12_4_ | (uint)!bVar75 * auVar27._12_4_);
        fVar164 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar90._16_4_);
        auVar104._16_4_ = fVar164;
        fVar172 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar90._20_4_);
        auVar104._20_4_ = fVar172;
        fVar173 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar90._24_4_);
        auVar104._24_4_ = fVar173;
        iVar1 = (uint)(byte)(uVar69 >> 7) * auVar90._28_4_;
        auVar104._28_4_ = iVar1;
        auVar107 = vblendmps_avx512vl(ZEXT1632(auVar87),auVar91);
        auVar111._0_4_ =
             (uint)(bVar71 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar19._0_4_;
        bVar75 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar111._4_4_ = (uint)bVar75 * auVar107._4_4_ | (uint)!bVar75 * auVar19._4_4_;
        bVar75 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar111._8_4_ = (uint)bVar75 * auVar107._8_4_ | (uint)!bVar75 * auVar19._8_4_;
        bVar75 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar111._12_4_ = (uint)bVar75 * auVar107._12_4_ | (uint)!bVar75 * auVar19._12_4_;
        auVar111._16_4_ = (uint)((byte)(uVar69 >> 4) & 1) * auVar107._16_4_;
        auVar111._20_4_ = (uint)((byte)(uVar69 >> 5) & 1) * auVar107._20_4_;
        auVar111._24_4_ = (uint)((byte)(uVar69 >> 6) & 1) * auVar107._24_4_;
        auVar111._28_4_ = (uint)(byte)(uVar69 >> 7) * auVar107._28_4_;
        auVar107 = vblendmps_avx512vl(ZEXT1632(auVar88),ZEXT1632(auVar86));
        auVar112._0_4_ =
             (float)((uint)(bVar71 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar84._0_4_
                    );
        bVar75 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar112._4_4_ = (float)((uint)bVar75 * auVar107._4_4_ | (uint)!bVar75 * auVar84._4_4_);
        bVar75 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar112._8_4_ = (float)((uint)bVar75 * auVar107._8_4_ | (uint)!bVar75 * auVar84._8_4_);
        bVar75 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar112._12_4_ = (float)((uint)bVar75 * auVar107._12_4_ | (uint)!bVar75 * auVar84._12_4_);
        fVar157 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar107._16_4_);
        auVar112._16_4_ = fVar157;
        fVar174 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar107._20_4_);
        auVar112._20_4_ = fVar174;
        fVar163 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar107._24_4_);
        auVar112._24_4_ = fVar163;
        auVar112._28_4_ = (uint)(byte)(uVar69 >> 7) * auVar107._28_4_;
        auVar107 = vblendmps_avx512vl(auVar103,ZEXT1632(auVar18));
        auVar113._0_4_ =
             (float)((uint)(bVar71 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar90._0_4_
                    );
        bVar75 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar113._4_4_ = (float)((uint)bVar75 * auVar107._4_4_ | (uint)!bVar75 * auVar90._4_4_);
        bVar75 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar113._8_4_ = (float)((uint)bVar75 * auVar107._8_4_ | (uint)!bVar75 * auVar90._8_4_);
        bVar75 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar113._12_4_ = (float)((uint)bVar75 * auVar107._12_4_ | (uint)!bVar75 * auVar90._12_4_);
        bVar75 = (bool)((byte)(uVar69 >> 4) & 1);
        auVar113._16_4_ = (float)((uint)bVar75 * auVar107._16_4_ | (uint)!bVar75 * auVar90._16_4_);
        bVar75 = (bool)((byte)(uVar69 >> 5) & 1);
        auVar113._20_4_ = (float)((uint)bVar75 * auVar107._20_4_ | (uint)!bVar75 * auVar90._20_4_);
        bVar75 = (bool)((byte)(uVar69 >> 6) & 1);
        auVar113._24_4_ = (float)((uint)bVar75 * auVar107._24_4_ | (uint)!bVar75 * auVar90._24_4_);
        bVar75 = SUB81(uVar69 >> 7,0);
        auVar113._28_4_ = (uint)bVar75 * auVar107._28_4_ | (uint)!bVar75 * auVar90._28_4_;
        auVar114._0_4_ =
             (uint)(bVar71 & 1) * (int)auVar87._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar91._0_4_;
        bVar75 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar114._4_4_ = (uint)bVar75 * (int)auVar87._4_4_ | (uint)!bVar75 * auVar91._4_4_;
        bVar75 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar114._8_4_ = (uint)bVar75 * (int)auVar87._8_4_ | (uint)!bVar75 * auVar91._8_4_;
        bVar75 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar114._12_4_ = (uint)bVar75 * (int)auVar87._12_4_ | (uint)!bVar75 * auVar91._12_4_;
        auVar114._16_4_ = (uint)!(bool)((byte)(uVar69 >> 4) & 1) * auVar91._16_4_;
        auVar114._20_4_ = (uint)!(bool)((byte)(uVar69 >> 5) & 1) * auVar91._20_4_;
        auVar114._24_4_ = (uint)!(bool)((byte)(uVar69 >> 6) & 1) * auVar91._24_4_;
        auVar114._28_4_ = (uint)!SUB81(uVar69 >> 7,0) * auVar91._28_4_;
        bVar75 = (bool)((byte)(uVar69 >> 1) & 1);
        bVar13 = (bool)((byte)(uVar69 >> 2) & 1);
        bVar15 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar115._0_4_ =
             (uint)(bVar71 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar18._0_4_;
        bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar115._4_4_ = (uint)bVar12 * auVar103._4_4_ | (uint)!bVar12 * auVar18._4_4_;
        bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar115._8_4_ = (uint)bVar12 * auVar103._8_4_ | (uint)!bVar12 * auVar18._8_4_;
        bVar12 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar115._12_4_ = (uint)bVar12 * auVar103._12_4_ | (uint)!bVar12 * auVar18._12_4_;
        auVar115._16_4_ = (uint)((byte)(uVar69 >> 4) & 1) * auVar103._16_4_;
        auVar115._20_4_ = (uint)((byte)(uVar69 >> 5) & 1) * auVar103._20_4_;
        auVar115._24_4_ = (uint)((byte)(uVar69 >> 6) & 1) * auVar103._24_4_;
        iVar2 = (uint)(byte)(uVar69 >> 7) * auVar103._28_4_;
        auVar115._28_4_ = iVar2;
        auVar93 = vsubps_avx512vl(auVar114,auVar101);
        auVar107 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar15 * (int)auVar88._12_4_ |
                                                 (uint)!bVar15 * auVar86._12_4_,
                                                 CONCAT48((uint)bVar13 * (int)auVar88._8_4_ |
                                                          (uint)!bVar13 * auVar86._8_4_,
                                                          CONCAT44((uint)bVar75 * (int)auVar88._4_4_
                                                                   | (uint)!bVar75 * auVar86._4_4_,
                                                                   (uint)(bVar71 & 1) *
                                                                   (int)auVar88._0_4_ |
                                                                   (uint)!(bool)(bVar71 & 1) *
                                                                   auVar86._0_4_)))),auVar92);
        auVar103 = vsubps_avx(auVar115,auVar104);
        auVar102 = vsubps_avx(auVar101,auVar111);
        auVar90 = vsubps_avx(auVar92,auVar112);
        auVar91 = vsubps_avx(auVar104,auVar113);
        auVar96._4_4_ = auVar103._4_4_ * fVar127;
        auVar96._0_4_ = auVar103._0_4_ * fVar79;
        auVar96._8_4_ = auVar103._8_4_ * fVar129;
        auVar96._12_4_ = auVar103._12_4_ * fVar131;
        auVar96._16_4_ = auVar103._16_4_ * 0.0;
        auVar96._20_4_ = auVar103._20_4_ * 0.0;
        auVar96._24_4_ = auVar103._24_4_ * 0.0;
        auVar96._28_4_ = iVar2;
        auVar85 = vfmsub231ps_fma(auVar96,auVar104,auVar93);
        auVar97._4_4_ = fVar128 * auVar93._4_4_;
        auVar97._0_4_ = fVar80 * auVar93._0_4_;
        auVar97._8_4_ = fVar130 * auVar93._8_4_;
        auVar97._12_4_ = fVar132 * auVar93._12_4_;
        auVar97._16_4_ = auVar93._16_4_ * 0.0;
        auVar97._20_4_ = auVar93._20_4_ * 0.0;
        auVar97._24_4_ = auVar93._24_4_ * 0.0;
        auVar97._28_4_ = auVar105._28_4_;
        auVar84 = vfmsub231ps_fma(auVar97,auVar101,auVar107);
        auVar105 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),auVar106,ZEXT1632(auVar85));
        auVar168._0_4_ = auVar107._0_4_ * auVar104._0_4_;
        auVar168._4_4_ = auVar107._4_4_ * auVar104._4_4_;
        auVar168._8_4_ = auVar107._8_4_ * auVar104._8_4_;
        auVar168._12_4_ = auVar107._12_4_ * auVar104._12_4_;
        auVar168._16_4_ = auVar107._16_4_ * fVar164;
        auVar168._20_4_ = auVar107._20_4_ * fVar172;
        auVar168._24_4_ = auVar107._24_4_ * fVar173;
        auVar168._28_4_ = 0;
        auVar85 = vfmsub231ps_fma(auVar168,auVar92,auVar103);
        auVar94 = vfmadd231ps_avx512vl(auVar105,auVar106,ZEXT1632(auVar85));
        auVar105 = vmulps_avx512vl(auVar91,auVar111);
        auVar105 = vfmsub231ps_avx512vl(auVar105,auVar102,auVar113);
        auVar100._4_4_ = auVar90._4_4_ * auVar113._4_4_;
        auVar100._0_4_ = auVar90._0_4_ * auVar113._0_4_;
        auVar100._8_4_ = auVar90._8_4_ * auVar113._8_4_;
        auVar100._12_4_ = auVar90._12_4_ * auVar113._12_4_;
        auVar100._16_4_ = auVar90._16_4_ * auVar113._16_4_;
        auVar100._20_4_ = auVar90._20_4_ * auVar113._20_4_;
        auVar100._24_4_ = auVar90._24_4_ * auVar113._24_4_;
        auVar100._28_4_ = auVar113._28_4_;
        auVar85 = vfmsub231ps_fma(auVar100,auVar112,auVar91);
        auVar169._0_4_ = auVar112._0_4_ * auVar102._0_4_;
        auVar169._4_4_ = auVar112._4_4_ * auVar102._4_4_;
        auVar169._8_4_ = auVar112._8_4_ * auVar102._8_4_;
        auVar169._12_4_ = auVar112._12_4_ * auVar102._12_4_;
        auVar169._16_4_ = fVar157 * auVar102._16_4_;
        auVar169._20_4_ = fVar174 * auVar102._20_4_;
        auVar169._24_4_ = fVar163 * auVar102._24_4_;
        auVar169._28_4_ = 0;
        auVar84 = vfmsub231ps_fma(auVar169,auVar90,auVar111);
        auVar105 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),auVar106,auVar105);
        auVar96 = vfmadd231ps_avx512vl(auVar105,auVar106,ZEXT1632(auVar85));
        auVar105 = vmaxps_avx(auVar94,auVar96);
        uVar135 = vcmpps_avx512vl(auVar105,auVar106,2);
        local_630 = local_630 & (byte)uVar135;
        auVar202 = ZEXT3264(local_7a0);
        auVar203 = ZEXT3264(local_740);
        auVar204 = ZEXT3264(local_7c0);
        auVar201 = ZEXT3264(local_900);
        auVar196 = ZEXT1664(_local_990);
        if (local_630 == 0) {
          local_630 = 0;
        }
        else {
          auVar38._4_4_ = auVar91._4_4_ * auVar107._4_4_;
          auVar38._0_4_ = auVar91._0_4_ * auVar107._0_4_;
          auVar38._8_4_ = auVar91._8_4_ * auVar107._8_4_;
          auVar38._12_4_ = auVar91._12_4_ * auVar107._12_4_;
          auVar38._16_4_ = auVar91._16_4_ * auVar107._16_4_;
          auVar38._20_4_ = auVar91._20_4_ * auVar107._20_4_;
          auVar38._24_4_ = auVar91._24_4_ * auVar107._24_4_;
          auVar38._28_4_ = auVar105._28_4_;
          auVar86 = vfmsub231ps_fma(auVar38,auVar90,auVar103);
          auVar39._4_4_ = auVar103._4_4_ * auVar102._4_4_;
          auVar39._0_4_ = auVar103._0_4_ * auVar102._0_4_;
          auVar39._8_4_ = auVar103._8_4_ * auVar102._8_4_;
          auVar39._12_4_ = auVar103._12_4_ * auVar102._12_4_;
          auVar39._16_4_ = auVar103._16_4_ * auVar102._16_4_;
          auVar39._20_4_ = auVar103._20_4_ * auVar102._20_4_;
          auVar39._24_4_ = auVar103._24_4_ * auVar102._24_4_;
          auVar39._28_4_ = auVar103._28_4_;
          auVar84 = vfmsub231ps_fma(auVar39,auVar93,auVar91);
          auVar40._4_4_ = auVar90._4_4_ * auVar93._4_4_;
          auVar40._0_4_ = auVar90._0_4_ * auVar93._0_4_;
          auVar40._8_4_ = auVar90._8_4_ * auVar93._8_4_;
          auVar40._12_4_ = auVar90._12_4_ * auVar93._12_4_;
          auVar40._16_4_ = auVar90._16_4_ * auVar93._16_4_;
          auVar40._20_4_ = auVar90._20_4_ * auVar93._20_4_;
          auVar40._24_4_ = auVar90._24_4_ * auVar93._24_4_;
          auVar40._28_4_ = auVar90._28_4_;
          auVar18 = vfmsub231ps_fma(auVar40,auVar102,auVar107);
          auVar85 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar84),ZEXT1632(auVar18));
          auVar105 = vfmadd231ps_avx512vl(ZEXT1632(auVar85),ZEXT1632(auVar86),auVar106);
          auVar107 = vrcp14ps_avx512vl(auVar105);
          auVar31._8_4_ = 0x3f800000;
          auVar31._0_8_ = &DAT_3f8000003f800000;
          auVar31._12_4_ = 0x3f800000;
          auVar31._16_4_ = 0x3f800000;
          auVar31._20_4_ = 0x3f800000;
          auVar31._24_4_ = 0x3f800000;
          auVar31._28_4_ = 0x3f800000;
          auVar103 = vfnmadd213ps_avx512vl(auVar107,auVar105,auVar31);
          auVar85 = vfmadd132ps_fma(auVar103,auVar107,auVar107);
          auVar41._4_4_ = auVar18._4_4_ * auVar104._4_4_;
          auVar41._0_4_ = auVar18._0_4_ * auVar104._0_4_;
          auVar41._8_4_ = auVar18._8_4_ * auVar104._8_4_;
          auVar41._12_4_ = auVar18._12_4_ * auVar104._12_4_;
          auVar41._16_4_ = fVar164 * 0.0;
          auVar41._20_4_ = fVar172 * 0.0;
          auVar41._24_4_ = fVar173 * 0.0;
          auVar41._28_4_ = iVar1;
          auVar84 = vfmadd231ps_fma(auVar41,auVar92,ZEXT1632(auVar84));
          auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar101,ZEXT1632(auVar86));
          fVar164 = auVar85._0_4_;
          fVar172 = auVar85._4_4_;
          fVar173 = auVar85._8_4_;
          fVar174 = auVar85._12_4_;
          auVar107 = ZEXT1632(CONCAT412(auVar84._12_4_ * fVar174,
                                        CONCAT48(auVar84._8_4_ * fVar173,
                                                 CONCAT44(auVar84._4_4_ * fVar172,
                                                          auVar84._0_4_ * fVar164))));
          auVar186._4_4_ = fVar165;
          auVar186._0_4_ = fVar165;
          auVar186._8_4_ = fVar165;
          auVar186._12_4_ = fVar165;
          auVar186._16_4_ = fVar165;
          auVar186._20_4_ = fVar165;
          auVar186._24_4_ = fVar165;
          auVar186._28_4_ = fVar165;
          uVar135 = vcmpps_avx512vl(auVar186,auVar107,2);
          uVar134 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar32._4_4_ = uVar134;
          auVar32._0_4_ = uVar134;
          auVar32._8_4_ = uVar134;
          auVar32._12_4_ = uVar134;
          auVar32._16_4_ = uVar134;
          auVar32._20_4_ = uVar134;
          auVar32._24_4_ = uVar134;
          auVar32._28_4_ = uVar134;
          uVar24 = vcmpps_avx512vl(auVar107,auVar32,2);
          local_630 = (byte)uVar135 & (byte)uVar24 & local_630;
          if (local_630 != 0) {
            uVar135 = vcmpps_avx512vl(auVar105,auVar106,4);
            if ((local_630 & (byte)uVar135) != 0) {
              local_630 = local_630 & (byte)uVar135;
              fVar157 = auVar94._0_4_ * fVar164;
              fVar163 = auVar94._4_4_ * fVar172;
              auVar42._4_4_ = fVar163;
              auVar42._0_4_ = fVar157;
              fVar79 = auVar94._8_4_ * fVar173;
              auVar42._8_4_ = fVar79;
              fVar80 = auVar94._12_4_ * fVar174;
              auVar42._12_4_ = fVar80;
              fVar127 = auVar94._16_4_ * 0.0;
              auVar42._16_4_ = fVar127;
              fVar128 = auVar94._20_4_ * 0.0;
              auVar42._20_4_ = fVar128;
              fVar129 = auVar94._24_4_ * 0.0;
              auVar42._24_4_ = fVar129;
              auVar42._28_4_ = auVar94._28_4_;
              fVar164 = auVar96._0_4_ * fVar164;
              fVar172 = auVar96._4_4_ * fVar172;
              auVar43._4_4_ = fVar172;
              auVar43._0_4_ = fVar164;
              fVar173 = auVar96._8_4_ * fVar173;
              auVar43._8_4_ = fVar173;
              fVar174 = auVar96._12_4_ * fVar174;
              auVar43._12_4_ = fVar174;
              fVar130 = auVar96._16_4_ * 0.0;
              auVar43._16_4_ = fVar130;
              fVar131 = auVar96._20_4_ * 0.0;
              auVar43._20_4_ = fVar131;
              fVar132 = auVar96._24_4_ * 0.0;
              auVar43._24_4_ = fVar132;
              auVar43._28_4_ = auVar96._28_4_;
              auVar180._8_4_ = 0x3f800000;
              auVar180._0_8_ = &DAT_3f8000003f800000;
              auVar180._12_4_ = 0x3f800000;
              auVar180._16_4_ = 0x3f800000;
              auVar180._20_4_ = 0x3f800000;
              auVar180._24_4_ = 0x3f800000;
              auVar180._28_4_ = 0x3f800000;
              auVar105 = vsubps_avx(auVar180,auVar42);
              local_940._0_4_ =
                   (uint)(bVar71 & 1) * (int)fVar157 | (uint)!(bool)(bVar71 & 1) * auVar105._0_4_;
              bVar75 = (bool)((byte)(uVar69 >> 1) & 1);
              local_940._4_4_ = (uint)bVar75 * (int)fVar163 | (uint)!bVar75 * auVar105._4_4_;
              bVar75 = (bool)((byte)(uVar69 >> 2) & 1);
              local_940._8_4_ = (uint)bVar75 * (int)fVar79 | (uint)!bVar75 * auVar105._8_4_;
              bVar75 = (bool)((byte)(uVar69 >> 3) & 1);
              local_940._12_4_ = (uint)bVar75 * (int)fVar80 | (uint)!bVar75 * auVar105._12_4_;
              bVar75 = (bool)((byte)(uVar69 >> 4) & 1);
              local_940._16_4_ = (uint)bVar75 * (int)fVar127 | (uint)!bVar75 * auVar105._16_4_;
              bVar75 = (bool)((byte)(uVar69 >> 5) & 1);
              local_940._20_4_ = (uint)bVar75 * (int)fVar128 | (uint)!bVar75 * auVar105._20_4_;
              bVar75 = (bool)((byte)(uVar69 >> 6) & 1);
              local_940._24_4_ = (uint)bVar75 * (int)fVar129 | (uint)!bVar75 * auVar105._24_4_;
              bVar75 = SUB81(uVar69 >> 7,0);
              local_940._28_4_ = (uint)bVar75 * auVar94._28_4_ | (uint)!bVar75 * auVar105._28_4_;
              auVar105 = vsubps_avx(auVar180,auVar43);
              local_540._0_4_ =
                   (uint)(bVar71 & 1) * (int)fVar164 | (uint)!(bool)(bVar71 & 1) * auVar105._0_4_;
              bVar75 = (bool)((byte)(uVar69 >> 1) & 1);
              local_540._4_4_ = (uint)bVar75 * (int)fVar172 | (uint)!bVar75 * auVar105._4_4_;
              bVar75 = (bool)((byte)(uVar69 >> 2) & 1);
              local_540._8_4_ = (uint)bVar75 * (int)fVar173 | (uint)!bVar75 * auVar105._8_4_;
              bVar75 = (bool)((byte)(uVar69 >> 3) & 1);
              local_540._12_4_ = (uint)bVar75 * (int)fVar174 | (uint)!bVar75 * auVar105._12_4_;
              bVar75 = (bool)((byte)(uVar69 >> 4) & 1);
              local_540._16_4_ = (uint)bVar75 * (int)fVar130 | (uint)!bVar75 * auVar105._16_4_;
              bVar75 = (bool)((byte)(uVar69 >> 5) & 1);
              local_540._20_4_ = (uint)bVar75 * (int)fVar131 | (uint)!bVar75 * auVar105._20_4_;
              bVar75 = (bool)((byte)(uVar69 >> 6) & 1);
              local_540._24_4_ = (uint)bVar75 * (int)fVar132 | (uint)!bVar75 * auVar105._24_4_;
              bVar75 = SUB81(uVar69 >> 7,0);
              local_540._28_4_ = (uint)bVar75 * auVar96._28_4_ | (uint)!bVar75 * auVar105._28_4_;
              local_960 = auVar107;
              goto LAB_01c19ff2;
            }
          }
          local_630 = 0;
        }
LAB_01c19ff2:
        auVar207 = ZEXT3264(local_840);
        auVar146 = ZEXT3264(local_820);
        auVar206 = ZEXT3264(local_800);
        auVar200 = ZEXT3264(auVar95);
        if (local_630 != 0) {
          auVar105 = vsubps_avx(ZEXT1632(auVar23),auVar98);
          auVar85 = vfmadd213ps_fma(auVar105,local_940,auVar98);
          uVar134 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
          auVar98._4_4_ = uVar134;
          auVar98._0_4_ = uVar134;
          auVar98._8_4_ = uVar134;
          auVar98._12_4_ = uVar134;
          auVar98._16_4_ = uVar134;
          auVar98._20_4_ = uVar134;
          auVar98._24_4_ = uVar134;
          auVar98._28_4_ = uVar134;
          auVar105 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar85._12_4_ + auVar85._12_4_,
                                                        CONCAT48(auVar85._8_4_ + auVar85._8_4_,
                                                                 CONCAT44(auVar85._4_4_ +
                                                                          auVar85._4_4_,
                                                                          auVar85._0_4_ +
                                                                          auVar85._0_4_)))),auVar98)
          ;
          uVar135 = vcmpps_avx512vl(local_960,auVar105,6);
          local_630 = local_630 & (byte)uVar135;
          if (local_630 != 0) {
            auVar144._8_4_ = 0xbf800000;
            auVar144._0_8_ = 0xbf800000bf800000;
            auVar144._12_4_ = 0xbf800000;
            auVar144._16_4_ = 0xbf800000;
            auVar144._20_4_ = 0xbf800000;
            auVar144._24_4_ = 0xbf800000;
            auVar144._28_4_ = 0xbf800000;
            auVar33._8_4_ = 0x40000000;
            auVar33._0_8_ = 0x4000000040000000;
            auVar33._12_4_ = 0x40000000;
            auVar33._16_4_ = 0x40000000;
            auVar33._20_4_ = 0x40000000;
            auVar33._24_4_ = 0x40000000;
            auVar33._28_4_ = 0x40000000;
            local_6c0 = vfmadd132ps_avx512vl(local_540,auVar144,auVar33);
            local_540 = local_6c0;
            auVar105 = local_540;
            local_680 = 0;
            local_670 = local_970._0_8_;
            uStack_668 = local_970._8_8_;
            local_660 = local_750._0_8_;
            uStack_658 = local_750._8_8_;
            local_650 = local_760._0_8_;
            uStack_648 = local_760._8_8_;
            local_640 = local_770._0_8_;
            uStack_638 = local_770._8_8_;
            if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (bVar75 = true, pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                fVar147 = 1.0 / auVar99._0_4_;
                local_620[0] = fVar147 * (local_940._0_4_ + 0.0);
                local_620[1] = fVar147 * (local_940._4_4_ + 1.0);
                local_620[2] = fVar147 * (local_940._8_4_ + 2.0);
                local_620[3] = fVar147 * (local_940._12_4_ + 3.0);
                fStack_610 = fVar147 * (local_940._16_4_ + 4.0);
                fStack_60c = fVar147 * (local_940._20_4_ + 5.0);
                fStack_608 = fVar147 * (local_940._24_4_ + 6.0);
                fStack_604 = local_940._28_4_ + 7.0;
                local_540._0_8_ = local_6c0._0_8_;
                local_540._8_8_ = local_6c0._8_8_;
                local_540._16_8_ = local_6c0._16_8_;
                local_540._24_8_ = local_6c0._24_8_;
                local_600 = local_540._0_8_;
                uStack_5f8 = local_540._8_8_;
                uStack_5f0 = local_540._16_8_;
                uStack_5e8 = local_540._24_8_;
                local_5e0 = local_960;
                local_720 = 0;
                uVar74 = (ulong)local_630;
                for (uVar69 = uVar74; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x8000000000000000)
                {
                  local_720 = local_720 + 1;
                }
                auVar125 = vpbroadcastd_avx512f();
                local_4c0 = vmovdqa64_avx512f(auVar125);
                local_980 = local_750._0_4_;
                uStack_97c = local_750._4_4_;
                uStack_978 = local_750._8_8_;
                auVar125 = vpbroadcastd_avx512f();
                local_500 = vmovdqa64_avx512f(auVar125);
                local_8c0 = local_760._0_8_;
                uStack_8b8 = local_760._8_8_;
                local_8d0 = local_770._0_4_;
                fStack_8cc = local_770._4_4_;
                fStack_8c8 = local_770._8_4_;
                fStack_8c4 = local_770._12_4_;
                bVar75 = true;
                local_860 = fVar165;
                local_7e0 = auVar95;
                local_6e0 = local_940;
                local_6a0 = local_960;
                local_67c = iVar7;
                local_540 = auVar105;
                do {
                  auVar86 = auVar205._0_16_;
                  uVar134 = *(undefined4 *)(ray + k * 4 + 0x200);
                  local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_620[local_720]));
                  local_1c0 = vbroadcastss_avx512f
                                        (ZEXT416(*(uint *)((long)&local_600 + local_720 * 4)));
                  *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_5e0 + local_720 * 4);
                  local_9c0.context = context->user;
                  fVar173 = local_200._0_4_;
                  fVar164 = 1.0 - fVar173;
                  fVar147 = fVar164 * fVar164 * -3.0;
                  auVar85 = vfmadd231ss_fma(ZEXT416((uint)(fVar164 * fVar164)),
                                            ZEXT416((uint)(fVar173 * fVar164)),ZEXT416(0xc0000000));
                  auVar84 = vfmsub132ss_fma(ZEXT416((uint)(fVar173 * fVar164)),
                                            ZEXT416((uint)(fVar173 * fVar173)),ZEXT416(0x40000000));
                  fVar164 = auVar85._0_4_ * 3.0;
                  fVar172 = auVar84._0_4_ * 3.0;
                  fVar173 = fVar173 * fVar173 * 3.0;
                  auVar178._0_4_ = fVar173 * local_8d0;
                  auVar178._4_4_ = fVar173 * fStack_8cc;
                  auVar178._8_4_ = fVar173 * fStack_8c8;
                  auVar178._12_4_ = fVar173 * fStack_8c4;
                  auVar140._4_4_ = fVar172;
                  auVar140._0_4_ = fVar172;
                  auVar140._8_4_ = fVar172;
                  auVar140._12_4_ = fVar172;
                  auVar65._8_8_ = uStack_8b8;
                  auVar65._0_8_ = local_8c0;
                  auVar85 = vfmadd132ps_fma(auVar140,auVar178,auVar65);
                  auVar160._4_4_ = fVar164;
                  auVar160._0_4_ = fVar164;
                  auVar160._8_4_ = fVar164;
                  auVar160._12_4_ = fVar164;
                  auVar63._4_4_ = uStack_97c;
                  auVar63._0_4_ = local_980;
                  auVar63._8_8_ = uStack_978;
                  auVar85 = vfmadd132ps_fma(auVar160,auVar85,auVar63);
                  auVar141._4_4_ = fVar147;
                  auVar141._0_4_ = fVar147;
                  auVar141._8_4_ = fVar147;
                  auVar141._12_4_ = fVar147;
                  auVar85 = vfmadd132ps_fma(auVar141,auVar85,local_970);
                  auVar125 = vbroadcastss_avx512f(auVar85);
                  auVar126 = vbroadcastss_avx512f(ZEXT416(1));
                  local_280 = vpermps_avx512f(auVar126,ZEXT1664(auVar85));
                  auVar126 = vbroadcastss_avx512f(ZEXT416(2));
                  local_240 = vpermps_avx512f(auVar126,ZEXT1664(auVar85));
                  local_2c0[0] = (RTCHitN)auVar125[0];
                  local_2c0[1] = (RTCHitN)auVar125[1];
                  local_2c0[2] = (RTCHitN)auVar125[2];
                  local_2c0[3] = (RTCHitN)auVar125[3];
                  local_2c0[4] = (RTCHitN)auVar125[4];
                  local_2c0[5] = (RTCHitN)auVar125[5];
                  local_2c0[6] = (RTCHitN)auVar125[6];
                  local_2c0[7] = (RTCHitN)auVar125[7];
                  local_2c0[8] = (RTCHitN)auVar125[8];
                  local_2c0[9] = (RTCHitN)auVar125[9];
                  local_2c0[10] = (RTCHitN)auVar125[10];
                  local_2c0[0xb] = (RTCHitN)auVar125[0xb];
                  local_2c0[0xc] = (RTCHitN)auVar125[0xc];
                  local_2c0[0xd] = (RTCHitN)auVar125[0xd];
                  local_2c0[0xe] = (RTCHitN)auVar125[0xe];
                  local_2c0[0xf] = (RTCHitN)auVar125[0xf];
                  local_2c0[0x10] = (RTCHitN)auVar125[0x10];
                  local_2c0[0x11] = (RTCHitN)auVar125[0x11];
                  local_2c0[0x12] = (RTCHitN)auVar125[0x12];
                  local_2c0[0x13] = (RTCHitN)auVar125[0x13];
                  local_2c0[0x14] = (RTCHitN)auVar125[0x14];
                  local_2c0[0x15] = (RTCHitN)auVar125[0x15];
                  local_2c0[0x16] = (RTCHitN)auVar125[0x16];
                  local_2c0[0x17] = (RTCHitN)auVar125[0x17];
                  local_2c0[0x18] = (RTCHitN)auVar125[0x18];
                  local_2c0[0x19] = (RTCHitN)auVar125[0x19];
                  local_2c0[0x1a] = (RTCHitN)auVar125[0x1a];
                  local_2c0[0x1b] = (RTCHitN)auVar125[0x1b];
                  local_2c0[0x1c] = (RTCHitN)auVar125[0x1c];
                  local_2c0[0x1d] = (RTCHitN)auVar125[0x1d];
                  local_2c0[0x1e] = (RTCHitN)auVar125[0x1e];
                  local_2c0[0x1f] = (RTCHitN)auVar125[0x1f];
                  local_2c0[0x20] = (RTCHitN)auVar125[0x20];
                  local_2c0[0x21] = (RTCHitN)auVar125[0x21];
                  local_2c0[0x22] = (RTCHitN)auVar125[0x22];
                  local_2c0[0x23] = (RTCHitN)auVar125[0x23];
                  local_2c0[0x24] = (RTCHitN)auVar125[0x24];
                  local_2c0[0x25] = (RTCHitN)auVar125[0x25];
                  local_2c0[0x26] = (RTCHitN)auVar125[0x26];
                  local_2c0[0x27] = (RTCHitN)auVar125[0x27];
                  local_2c0[0x28] = (RTCHitN)auVar125[0x28];
                  local_2c0[0x29] = (RTCHitN)auVar125[0x29];
                  local_2c0[0x2a] = (RTCHitN)auVar125[0x2a];
                  local_2c0[0x2b] = (RTCHitN)auVar125[0x2b];
                  local_2c0[0x2c] = (RTCHitN)auVar125[0x2c];
                  local_2c0[0x2d] = (RTCHitN)auVar125[0x2d];
                  local_2c0[0x2e] = (RTCHitN)auVar125[0x2e];
                  local_2c0[0x2f] = (RTCHitN)auVar125[0x2f];
                  local_2c0[0x30] = (RTCHitN)auVar125[0x30];
                  local_2c0[0x31] = (RTCHitN)auVar125[0x31];
                  local_2c0[0x32] = (RTCHitN)auVar125[0x32];
                  local_2c0[0x33] = (RTCHitN)auVar125[0x33];
                  local_2c0[0x34] = (RTCHitN)auVar125[0x34];
                  local_2c0[0x35] = (RTCHitN)auVar125[0x35];
                  local_2c0[0x36] = (RTCHitN)auVar125[0x36];
                  local_2c0[0x37] = (RTCHitN)auVar125[0x37];
                  local_2c0[0x38] = (RTCHitN)auVar125[0x38];
                  local_2c0[0x39] = (RTCHitN)auVar125[0x39];
                  local_2c0[0x3a] = (RTCHitN)auVar125[0x3a];
                  local_2c0[0x3b] = (RTCHitN)auVar125[0x3b];
                  local_2c0[0x3c] = (RTCHitN)auVar125[0x3c];
                  local_2c0[0x3d] = (RTCHitN)auVar125[0x3d];
                  local_2c0[0x3e] = (RTCHitN)auVar125[0x3e];
                  local_2c0[0x3f] = (RTCHitN)auVar125[0x3f];
                  local_180 = local_500._0_8_;
                  uStack_178 = local_500._8_8_;
                  uStack_170 = local_500._16_8_;
                  uStack_168 = local_500._24_8_;
                  uStack_160 = local_500._32_8_;
                  uStack_158 = local_500._40_8_;
                  uStack_150 = local_500._48_8_;
                  uStack_148 = local_500._56_8_;
                  auVar125 = vmovdqa64_avx512f(local_4c0);
                  local_140 = vmovdqa64_avx512f(auVar125);
                  vpcmpeqd_avx2(auVar125._0_32_,auVar125._0_32_);
                  local_100 = vbroadcastss_avx512f(ZEXT416((local_9c0.context)->instID[0]));
                  local_c0 = vbroadcastss_avx512f(ZEXT416((local_9c0.context)->instPrimID[0]));
                  local_5c0 = local_300;
                  local_9c0.valid = (int *)local_5c0;
                  local_9c0.geometryUserPtr = pGVar8->userPtr;
                  local_9c0.hit = local_2c0;
                  local_9c0.N = 0x10;
                  local_700 = (undefined4)uVar74;
                  uStack_6fc = (undefined4)(uVar74 >> 0x20);
                  local_9c0.ray = (RTCRayN *)ray;
                  if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar8->occlusionFilterN)(&local_9c0);
                    uVar74 = CONCAT44(uStack_6fc,local_700);
                    auVar196 = ZEXT1664(_local_990);
                    auVar200 = ZEXT3264(local_7e0);
                    auVar207 = ZEXT3264(local_840);
                    auVar146 = ZEXT3264(local_820);
                    auVar206 = ZEXT3264(local_800);
                    auVar208 = ZEXT3264(local_920);
                    auVar201 = ZEXT3264(local_900);
                    auVar204 = ZEXT3264(local_7c0);
                    auVar203 = ZEXT3264(local_740);
                    auVar202 = ZEXT3264(local_7a0);
                    auVar85 = vxorps_avx512vl(auVar86,auVar86);
                    auVar205 = ZEXT1664(auVar85);
                    fVar165 = local_860;
                  }
                  auVar85 = auVar205._0_16_;
                  auVar125 = vmovdqa64_avx512f(local_5c0);
                  uVar135 = vptestmd_avx512f(auVar125,auVar125);
                  if ((short)uVar135 != 0) {
                    p_Var11 = context->args->filter;
                    if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var11)(&local_9c0);
                      uVar74 = CONCAT44(uStack_6fc,local_700);
                      auVar196 = ZEXT1664(_local_990);
                      auVar200 = ZEXT3264(local_7e0);
                      auVar207 = ZEXT3264(local_840);
                      auVar146 = ZEXT3264(local_820);
                      auVar206 = ZEXT3264(local_800);
                      auVar208 = ZEXT3264(local_920);
                      auVar201 = ZEXT3264(local_900);
                      auVar204 = ZEXT3264(local_7c0);
                      auVar203 = ZEXT3264(local_740);
                      auVar202 = ZEXT3264(local_7a0);
                      auVar85 = vxorps_avx512vl(auVar85,auVar85);
                      auVar205 = ZEXT1664(auVar85);
                      fVar165 = local_860;
                    }
                    auVar95 = auVar200._0_32_;
                    auVar125 = vmovdqa64_avx512f(local_5c0);
                    uVar69 = vptestmd_avx512f(auVar125,auVar125);
                    auVar126 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                    bVar12 = (bool)((byte)uVar69 & 1);
                    auVar125._0_4_ =
                         (uint)bVar12 * auVar126._0_4_ |
                         (uint)!bVar12 * *(int *)(local_9c0.ray + 0x200);
                    bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
                    auVar125._4_4_ =
                         (uint)bVar12 * auVar126._4_4_ |
                         (uint)!bVar12 * *(int *)(local_9c0.ray + 0x204);
                    bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
                    auVar125._8_4_ =
                         (uint)bVar12 * auVar126._8_4_ |
                         (uint)!bVar12 * *(int *)(local_9c0.ray + 0x208);
                    bVar12 = (bool)((byte)(uVar69 >> 3) & 1);
                    auVar125._12_4_ =
                         (uint)bVar12 * auVar126._12_4_ |
                         (uint)!bVar12 * *(int *)(local_9c0.ray + 0x20c);
                    bVar12 = (bool)((byte)(uVar69 >> 4) & 1);
                    auVar125._16_4_ =
                         (uint)bVar12 * auVar126._16_4_ |
                         (uint)!bVar12 * *(int *)(local_9c0.ray + 0x210);
                    bVar12 = (bool)((byte)(uVar69 >> 5) & 1);
                    auVar125._20_4_ =
                         (uint)bVar12 * auVar126._20_4_ |
                         (uint)!bVar12 * *(int *)(local_9c0.ray + 0x214);
                    bVar12 = (bool)((byte)(uVar69 >> 6) & 1);
                    auVar125._24_4_ =
                         (uint)bVar12 * auVar126._24_4_ |
                         (uint)!bVar12 * *(int *)(local_9c0.ray + 0x218);
                    bVar12 = (bool)((byte)(uVar69 >> 7) & 1);
                    auVar125._28_4_ =
                         (uint)bVar12 * auVar126._28_4_ |
                         (uint)!bVar12 * *(int *)(local_9c0.ray + 0x21c);
                    bVar12 = (bool)((byte)(uVar69 >> 8) & 1);
                    auVar125._32_4_ =
                         (uint)bVar12 * auVar126._32_4_ |
                         (uint)!bVar12 * *(int *)(local_9c0.ray + 0x220);
                    bVar12 = (bool)((byte)(uVar69 >> 9) & 1);
                    auVar125._36_4_ =
                         (uint)bVar12 * auVar126._36_4_ |
                         (uint)!bVar12 * *(int *)(local_9c0.ray + 0x224);
                    bVar12 = (bool)((byte)(uVar69 >> 10) & 1);
                    auVar125._40_4_ =
                         (uint)bVar12 * auVar126._40_4_ |
                         (uint)!bVar12 * *(int *)(local_9c0.ray + 0x228);
                    bVar12 = (bool)((byte)(uVar69 >> 0xb) & 1);
                    auVar125._44_4_ =
                         (uint)bVar12 * auVar126._44_4_ |
                         (uint)!bVar12 * *(int *)(local_9c0.ray + 0x22c);
                    bVar12 = (bool)((byte)(uVar69 >> 0xc) & 1);
                    auVar125._48_4_ =
                         (uint)bVar12 * auVar126._48_4_ |
                         (uint)!bVar12 * *(int *)(local_9c0.ray + 0x230);
                    bVar12 = (bool)((byte)(uVar69 >> 0xd) & 1);
                    auVar125._52_4_ =
                         (uint)bVar12 * auVar126._52_4_ |
                         (uint)!bVar12 * *(int *)(local_9c0.ray + 0x234);
                    bVar12 = (bool)((byte)(uVar69 >> 0xe) & 1);
                    auVar125._56_4_ =
                         (uint)bVar12 * auVar126._56_4_ |
                         (uint)!bVar12 * *(int *)(local_9c0.ray + 0x238);
                    bVar12 = SUB81(uVar69 >> 0xf,0);
                    auVar125._60_4_ =
                         (uint)bVar12 * auVar126._60_4_ |
                         (uint)!bVar12 * *(int *)(local_9c0.ray + 0x23c);
                    *(undefined1 (*) [64])(local_9c0.ray + 0x200) = auVar125;
                    fVar147 = auVar196._0_4_;
                    if ((short)uVar69 != 0) break;
                  }
                  auVar95 = auVar200._0_32_;
                  *(undefined4 *)(ray + k * 4 + 0x200) = uVar134;
                  uVar69 = local_720 & 0x3f;
                  local_720 = 0;
                  uVar74 = uVar74 ^ 1L << uVar69;
                  for (uVar69 = uVar74; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x8000000000000000
                      ) {
                    local_720 = local_720 + 1;
                  }
                  bVar75 = uVar74 != 0;
                  fVar147 = auVar196._0_4_;
                } while (bVar75);
              }
              goto LAB_01c1a5e7;
            }
          }
        }
        bVar75 = false;
      }
LAB_01c1a5e7:
      local_860 = fVar147;
      if (8 < iVar7) {
        auVar105 = vpbroadcastd_avx512vl();
        auVar200 = ZEXT3264(auVar105);
        fStack_718 = 1.0 / (float)local_480._0_4_;
        auVar196 = vpbroadcastd_avx512f();
        local_480 = vmovdqa64_avx512f(auVar196);
        auVar196 = vpbroadcastd_avx512f();
        local_440 = vmovdqa64_avx512f(auVar196);
        lVar77 = 8;
        fStack_85c = local_860;
        fStack_858 = local_860;
        fStack_854 = local_860;
        fStack_850 = local_860;
        fStack_84c = local_860;
        fStack_848 = local_860;
        fStack_844 = local_860;
        local_7e0 = auVar95;
        fStack_714 = fStack_718;
        fStack_710 = fStack_718;
        fStack_70c = fStack_718;
        fStack_708 = fStack_718;
        fStack_704 = fStack_718;
        local_700 = fVar165;
        uStack_6fc = fVar165;
        uStack_6f8 = fVar165;
        uStack_6f4 = fVar165;
        uStack_6f0 = fVar165;
        uStack_6ec = fVar165;
        uStack_6e8 = fVar165;
        uStack_6e4 = fVar165;
        local_720._0_4_ = fStack_718;
        local_720._4_4_ = fStack_718;
        do {
          auVar105 = vpbroadcastd_avx512vl();
          auVar90 = vpor_avx2(auVar105,_DAT_0205a920);
          uVar24 = vpcmpgtd_avx512vl(auVar200._0_32_,auVar90);
          auVar105 = *(undefined1 (*) [32])(bezier_basis0 + lVar77 * 4 + lVar25);
          auVar107 = *(undefined1 (*) [32])(lVar25 + 0x2227768 + lVar77 * 4);
          auVar103 = *(undefined1 (*) [32])(lVar25 + 0x2227bec + lVar77 * 4);
          auVar102 = *(undefined1 (*) [32])(lVar25 + 0x2228070 + lVar77 * 4);
          local_820 = auVar146._0_32_;
          auVar91 = vmulps_avx512vl(local_820,auVar102);
          local_840 = auVar207._0_32_;
          auVar101 = vmulps_avx512vl(local_840,auVar102);
          auVar44._4_4_ = auVar102._4_4_ * (float)local_380._4_4_;
          auVar44._0_4_ = auVar102._0_4_ * (float)local_380._0_4_;
          auVar44._8_4_ = auVar102._8_4_ * fStack_378;
          auVar44._12_4_ = auVar102._12_4_ * fStack_374;
          auVar44._16_4_ = auVar102._16_4_ * fStack_370;
          auVar44._20_4_ = auVar102._20_4_ * fStack_36c;
          auVar44._24_4_ = auVar102._24_4_ * fStack_368;
          auVar44._28_4_ = auVar90._28_4_;
          auVar110 = auVar208._0_32_;
          auVar90 = vfmadd231ps_avx512vl(auVar91,auVar103,auVar110);
          local_800 = auVar206._0_32_;
          auVar91 = vfmadd231ps_avx512vl(auVar101,auVar103,local_800);
          auVar101 = vfmadd231ps_avx512vl(auVar44,auVar103,local_360);
          auVar109 = auVar204._0_32_;
          auVar90 = vfmadd231ps_avx512vl(auVar90,auVar107,auVar109);
          auVar106 = auVar201._0_32_;
          auVar91 = vfmadd231ps_avx512vl(auVar91,auVar107,auVar106);
          auVar85 = vfmadd231ps_fma(auVar101,auVar107,local_340);
          auVar108 = auVar202._0_32_;
          auVar94 = vfmadd231ps_avx512vl(auVar90,auVar105,auVar108);
          local_740 = auVar203._0_32_;
          auVar96 = vfmadd231ps_avx512vl(auVar91,auVar105,local_740);
          auVar90 = *(undefined1 (*) [32])(bezier_basis1 + lVar77 * 4 + lVar25);
          auVar91 = *(undefined1 (*) [32])(lVar25 + 0x2229b88 + lVar77 * 4);
          auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar105,local_320);
          auVar101 = *(undefined1 (*) [32])(lVar25 + 0x222a00c + lVar77 * 4);
          auVar92 = *(undefined1 (*) [32])(lVar25 + 0x222a490 + lVar77 * 4);
          auVar95 = vmulps_avx512vl(local_820,auVar92);
          auVar93 = vmulps_avx512vl(local_840,auVar92);
          auVar45._4_4_ = auVar92._4_4_ * (float)local_380._4_4_;
          auVar45._0_4_ = auVar92._0_4_ * (float)local_380._0_4_;
          auVar45._8_4_ = auVar92._8_4_ * fStack_378;
          auVar45._12_4_ = auVar92._12_4_ * fStack_374;
          auVar45._16_4_ = auVar92._16_4_ * fStack_370;
          auVar45._20_4_ = auVar92._20_4_ * fStack_36c;
          auVar45._24_4_ = auVar92._24_4_ * fStack_368;
          auVar45._28_4_ = uStack_364;
          auVar95 = vfmadd231ps_avx512vl(auVar95,auVar101,auVar110);
          auVar93 = vfmadd231ps_avx512vl(auVar93,auVar101,local_800);
          auVar97 = vfmadd231ps_avx512vl(auVar45,auVar101,local_360);
          auVar95 = vfmadd231ps_avx512vl(auVar95,auVar91,auVar109);
          auVar93 = vfmadd231ps_avx512vl(auVar93,auVar91,auVar106);
          auVar84 = vfmadd231ps_fma(auVar97,auVar91,local_340);
          auVar97 = vfmadd231ps_avx512vl(auVar95,auVar90,auVar108);
          auVar98 = vfmadd231ps_avx512vl(auVar93,auVar90,local_740);
          auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar90,local_320);
          auVar99 = vmaxps_avx512vl(ZEXT1632(auVar85),ZEXT1632(auVar84));
          auVar95 = vsubps_avx(auVar97,auVar94);
          auVar93 = vsubps_avx(auVar98,auVar96);
          auVar100 = vmulps_avx512vl(auVar96,auVar95);
          auVar104 = vmulps_avx512vl(auVar94,auVar93);
          auVar100 = vsubps_avx512vl(auVar100,auVar104);
          auVar104 = vmulps_avx512vl(auVar93,auVar93);
          auVar104 = vfmadd231ps_avx512vl(auVar104,auVar95,auVar95);
          auVar99 = vmulps_avx512vl(auVar99,auVar99);
          auVar99 = vmulps_avx512vl(auVar99,auVar104);
          auVar100 = vmulps_avx512vl(auVar100,auVar100);
          uVar135 = vcmpps_avx512vl(auVar100,auVar99,2);
          local_630 = (byte)uVar24 & (byte)uVar135;
          if (local_630 == 0) {
            auVar196 = ZEXT3264(auVar106);
            auVar208 = ZEXT3264(auVar110);
          }
          else {
            auVar92 = vmulps_avx512vl(local_7e0,auVar92);
            auVar101 = vfmadd213ps_avx512vl(auVar101,local_3e0,auVar92);
            auVar91 = vfmadd213ps_avx512vl(auVar91,local_3c0,auVar101);
            auVar90 = vfmadd213ps_avx512vl(auVar90,local_3a0,auVar91);
            auVar102 = vmulps_avx512vl(local_7e0,auVar102);
            auVar103 = vfmadd213ps_avx512vl(auVar103,local_3e0,auVar102);
            auVar107 = vfmadd213ps_avx512vl(auVar107,local_3c0,auVar103);
            auVar91 = vfmadd213ps_avx512vl(auVar105,local_3a0,auVar107);
            auVar105 = *(undefined1 (*) [32])(lVar25 + 0x22284f4 + lVar77 * 4);
            auVar107 = *(undefined1 (*) [32])(lVar25 + 0x2228978 + lVar77 * 4);
            auVar103 = *(undefined1 (*) [32])(lVar25 + 0x2228dfc + lVar77 * 4);
            auVar102 = *(undefined1 (*) [32])(lVar25 + 0x2229280 + lVar77 * 4);
            auVar101 = vmulps_avx512vl(local_820,auVar102);
            auVar92 = vmulps_avx512vl(local_840,auVar102);
            auVar102 = vmulps_avx512vl(local_7e0,auVar102);
            auVar101 = vfmadd231ps_avx512vl(auVar101,auVar103,auVar110);
            auVar92 = vfmadd231ps_avx512vl(auVar92,auVar103,local_800);
            auVar103 = vfmadd231ps_avx512vl(auVar102,local_3e0,auVar103);
            auVar102 = vfmadd231ps_avx512vl(auVar101,auVar107,auVar109);
            auVar101 = vfmadd231ps_avx512vl(auVar92,auVar107,auVar106);
            auVar107 = vfmadd231ps_avx512vl(auVar103,local_3c0,auVar107);
            auVar102 = vfmadd231ps_avx512vl(auVar102,auVar105,auVar108);
            auVar101 = vfmadd231ps_avx512vl(auVar101,auVar105,local_740);
            auVar92 = vfmadd231ps_avx512vl(auVar107,local_3a0,auVar105);
            auVar105 = *(undefined1 (*) [32])(lVar25 + 0x222a914 + lVar77 * 4);
            auVar107 = *(undefined1 (*) [32])(lVar25 + 0x222b21c + lVar77 * 4);
            auVar103 = *(undefined1 (*) [32])(lVar25 + 0x222b6a0 + lVar77 * 4);
            auVar99 = vmulps_avx512vl(local_820,auVar103);
            auVar100 = vmulps_avx512vl(local_840,auVar103);
            auVar103 = vmulps_avx512vl(local_7e0,auVar103);
            auVar99 = vfmadd231ps_avx512vl(auVar99,auVar107,auVar110);
            auVar100 = vfmadd231ps_avx512vl(auVar100,auVar107,local_800);
            auVar103 = vfmadd231ps_avx512vl(auVar103,local_3e0,auVar107);
            auVar107 = *(undefined1 (*) [32])(lVar25 + 0x222ad98 + lVar77 * 4);
            auVar99 = vfmadd231ps_avx512vl(auVar99,auVar107,auVar109);
            auVar100 = vfmadd231ps_avx512vl(auVar100,auVar107,auVar106);
            auVar107 = vfmadd231ps_avx512vl(auVar103,local_3c0,auVar107);
            auVar103 = vfmadd231ps_avx512vl(auVar99,auVar105,auVar108);
            auVar99 = vfmadd231ps_avx512vl(auVar100,auVar105,local_740);
            auVar107 = vfmadd231ps_avx512vl(auVar107,local_3a0,auVar105);
            auVar100 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar102,auVar100);
            vandps_avx512vl(auVar101,auVar100);
            auVar105 = vmaxps_avx(auVar100,auVar100);
            vandps_avx512vl(auVar92,auVar100);
            auVar105 = vmaxps_avx(auVar105,auVar100);
            auVar67._4_4_ = fStack_85c;
            auVar67._0_4_ = local_860;
            auVar67._8_4_ = fStack_858;
            auVar67._12_4_ = fStack_854;
            auVar67._16_4_ = fStack_850;
            auVar67._20_4_ = fStack_84c;
            auVar67._24_4_ = fStack_848;
            auVar67._28_4_ = fStack_844;
            uVar69 = vcmpps_avx512vl(auVar105,auVar67,1);
            bVar12 = (bool)((byte)uVar69 & 1);
            auVar116._0_4_ = (float)((uint)bVar12 * auVar95._0_4_ | (uint)!bVar12 * auVar102._0_4_);
            bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
            auVar116._4_4_ = (float)((uint)bVar12 * auVar95._4_4_ | (uint)!bVar12 * auVar102._4_4_);
            bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
            auVar116._8_4_ = (float)((uint)bVar12 * auVar95._8_4_ | (uint)!bVar12 * auVar102._8_4_);
            bVar12 = (bool)((byte)(uVar69 >> 3) & 1);
            auVar116._12_4_ =
                 (float)((uint)bVar12 * auVar95._12_4_ | (uint)!bVar12 * auVar102._12_4_);
            bVar12 = (bool)((byte)(uVar69 >> 4) & 1);
            auVar116._16_4_ =
                 (float)((uint)bVar12 * auVar95._16_4_ | (uint)!bVar12 * auVar102._16_4_);
            bVar12 = (bool)((byte)(uVar69 >> 5) & 1);
            auVar116._20_4_ =
                 (float)((uint)bVar12 * auVar95._20_4_ | (uint)!bVar12 * auVar102._20_4_);
            bVar12 = (bool)((byte)(uVar69 >> 6) & 1);
            auVar116._24_4_ =
                 (float)((uint)bVar12 * auVar95._24_4_ | (uint)!bVar12 * auVar102._24_4_);
            bVar12 = SUB81(uVar69 >> 7,0);
            auVar116._28_4_ = (uint)bVar12 * auVar95._28_4_ | (uint)!bVar12 * auVar102._28_4_;
            bVar12 = (bool)((byte)uVar69 & 1);
            auVar117._0_4_ = (float)((uint)bVar12 * auVar93._0_4_ | (uint)!bVar12 * auVar101._0_4_);
            bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
            auVar117._4_4_ = (float)((uint)bVar12 * auVar93._4_4_ | (uint)!bVar12 * auVar101._4_4_);
            bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
            auVar117._8_4_ = (float)((uint)bVar12 * auVar93._8_4_ | (uint)!bVar12 * auVar101._8_4_);
            bVar12 = (bool)((byte)(uVar69 >> 3) & 1);
            auVar117._12_4_ =
                 (float)((uint)bVar12 * auVar93._12_4_ | (uint)!bVar12 * auVar101._12_4_);
            bVar12 = (bool)((byte)(uVar69 >> 4) & 1);
            auVar117._16_4_ =
                 (float)((uint)bVar12 * auVar93._16_4_ | (uint)!bVar12 * auVar101._16_4_);
            bVar12 = (bool)((byte)(uVar69 >> 5) & 1);
            auVar117._20_4_ =
                 (float)((uint)bVar12 * auVar93._20_4_ | (uint)!bVar12 * auVar101._20_4_);
            bVar12 = (bool)((byte)(uVar69 >> 6) & 1);
            auVar117._24_4_ =
                 (float)((uint)bVar12 * auVar93._24_4_ | (uint)!bVar12 * auVar101._24_4_);
            bVar12 = SUB81(uVar69 >> 7,0);
            auVar117._28_4_ = (uint)bVar12 * auVar93._28_4_ | (uint)!bVar12 * auVar101._28_4_;
            vandps_avx512vl(auVar103,auVar100);
            vandps_avx512vl(auVar99,auVar100);
            auVar105 = vmaxps_avx(auVar117,auVar117);
            vandps_avx512vl(auVar107,auVar100);
            auVar105 = vmaxps_avx(auVar105,auVar117);
            uVar69 = vcmpps_avx512vl(auVar105,auVar67,1);
            bVar12 = (bool)((byte)uVar69 & 1);
            auVar118._0_4_ = (uint)bVar12 * auVar95._0_4_ | (uint)!bVar12 * auVar103._0_4_;
            bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
            auVar118._4_4_ = (uint)bVar12 * auVar95._4_4_ | (uint)!bVar12 * auVar103._4_4_;
            bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
            auVar118._8_4_ = (uint)bVar12 * auVar95._8_4_ | (uint)!bVar12 * auVar103._8_4_;
            bVar12 = (bool)((byte)(uVar69 >> 3) & 1);
            auVar118._12_4_ = (uint)bVar12 * auVar95._12_4_ | (uint)!bVar12 * auVar103._12_4_;
            bVar12 = (bool)((byte)(uVar69 >> 4) & 1);
            auVar118._16_4_ = (uint)bVar12 * auVar95._16_4_ | (uint)!bVar12 * auVar103._16_4_;
            bVar12 = (bool)((byte)(uVar69 >> 5) & 1);
            auVar118._20_4_ = (uint)bVar12 * auVar95._20_4_ | (uint)!bVar12 * auVar103._20_4_;
            bVar12 = (bool)((byte)(uVar69 >> 6) & 1);
            auVar118._24_4_ = (uint)bVar12 * auVar95._24_4_ | (uint)!bVar12 * auVar103._24_4_;
            bVar12 = SUB81(uVar69 >> 7,0);
            auVar118._28_4_ = (uint)bVar12 * auVar95._28_4_ | (uint)!bVar12 * auVar103._28_4_;
            bVar12 = (bool)((byte)uVar69 & 1);
            auVar119._0_4_ = (float)((uint)bVar12 * auVar93._0_4_ | (uint)!bVar12 * auVar99._0_4_);
            bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
            auVar119._4_4_ = (float)((uint)bVar12 * auVar93._4_4_ | (uint)!bVar12 * auVar99._4_4_);
            bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
            auVar119._8_4_ = (float)((uint)bVar12 * auVar93._8_4_ | (uint)!bVar12 * auVar99._8_4_);
            bVar12 = (bool)((byte)(uVar69 >> 3) & 1);
            auVar119._12_4_ =
                 (float)((uint)bVar12 * auVar93._12_4_ | (uint)!bVar12 * auVar99._12_4_);
            bVar12 = (bool)((byte)(uVar69 >> 4) & 1);
            auVar119._16_4_ =
                 (float)((uint)bVar12 * auVar93._16_4_ | (uint)!bVar12 * auVar99._16_4_);
            bVar12 = (bool)((byte)(uVar69 >> 5) & 1);
            auVar119._20_4_ =
                 (float)((uint)bVar12 * auVar93._20_4_ | (uint)!bVar12 * auVar99._20_4_);
            bVar12 = (bool)((byte)(uVar69 >> 6) & 1);
            auVar119._24_4_ =
                 (float)((uint)bVar12 * auVar93._24_4_ | (uint)!bVar12 * auVar99._24_4_);
            bVar12 = SUB81(uVar69 >> 7,0);
            auVar119._28_4_ = (uint)bVar12 * auVar93._28_4_ | (uint)!bVar12 * auVar99._28_4_;
            auVar190._8_4_ = 0x80000000;
            auVar190._0_8_ = 0x8000000080000000;
            auVar190._12_4_ = 0x80000000;
            auVar190._16_4_ = 0x80000000;
            auVar190._20_4_ = 0x80000000;
            auVar190._24_4_ = 0x80000000;
            auVar190._28_4_ = 0x80000000;
            auVar105 = vxorps_avx512vl(auVar118,auVar190);
            auVar99 = auVar205._0_32_;
            auVar107 = vfmadd213ps_avx512vl(auVar116,auVar116,auVar99);
            auVar86 = vfmadd231ps_fma(auVar107,auVar117,auVar117);
            auVar107 = vrsqrt14ps_avx512vl(ZEXT1632(auVar86));
            auVar199._8_4_ = 0xbf000000;
            auVar199._0_8_ = 0xbf000000bf000000;
            auVar199._12_4_ = 0xbf000000;
            auVar199._16_4_ = 0xbf000000;
            auVar199._20_4_ = 0xbf000000;
            auVar199._24_4_ = 0xbf000000;
            auVar199._28_4_ = 0xbf000000;
            fVar165 = auVar107._0_4_;
            fVar147 = auVar107._4_4_;
            fVar164 = auVar107._8_4_;
            fVar172 = auVar107._12_4_;
            fVar173 = auVar107._16_4_;
            fVar174 = auVar107._20_4_;
            fVar157 = auVar107._24_4_;
            auVar46._4_4_ = fVar147 * fVar147 * fVar147 * auVar86._4_4_ * -0.5;
            auVar46._0_4_ = fVar165 * fVar165 * fVar165 * auVar86._0_4_ * -0.5;
            auVar46._8_4_ = fVar164 * fVar164 * fVar164 * auVar86._8_4_ * -0.5;
            auVar46._12_4_ = fVar172 * fVar172 * fVar172 * auVar86._12_4_ * -0.5;
            auVar46._16_4_ = fVar173 * fVar173 * fVar173 * -0.0;
            auVar46._20_4_ = fVar174 * fVar174 * fVar174 * -0.0;
            auVar46._24_4_ = fVar157 * fVar157 * fVar157 * -0.0;
            auVar46._28_4_ = auVar117._28_4_;
            auVar103 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar107 = vfmadd231ps_avx512vl(auVar46,auVar103,auVar107);
            auVar47._4_4_ = auVar117._4_4_ * auVar107._4_4_;
            auVar47._0_4_ = auVar117._0_4_ * auVar107._0_4_;
            auVar47._8_4_ = auVar117._8_4_ * auVar107._8_4_;
            auVar47._12_4_ = auVar117._12_4_ * auVar107._12_4_;
            auVar47._16_4_ = auVar117._16_4_ * auVar107._16_4_;
            auVar47._20_4_ = auVar117._20_4_ * auVar107._20_4_;
            auVar47._24_4_ = auVar117._24_4_ * auVar107._24_4_;
            auVar47._28_4_ = 0;
            auVar48._4_4_ = auVar107._4_4_ * -auVar116._4_4_;
            auVar48._0_4_ = auVar107._0_4_ * -auVar116._0_4_;
            auVar48._8_4_ = auVar107._8_4_ * -auVar116._8_4_;
            auVar48._12_4_ = auVar107._12_4_ * -auVar116._12_4_;
            auVar48._16_4_ = auVar107._16_4_ * -auVar116._16_4_;
            auVar48._20_4_ = auVar107._20_4_ * -auVar116._20_4_;
            auVar48._24_4_ = auVar107._24_4_ * -auVar116._24_4_;
            auVar48._28_4_ = auVar117._28_4_;
            auVar102 = vmulps_avx512vl(auVar107,auVar99);
            auVar107 = vfmadd213ps_avx512vl(auVar118,auVar118,auVar99);
            auVar107 = vfmadd231ps_avx512vl(auVar107,auVar119,auVar119);
            auVar101 = vrsqrt14ps_avx512vl(auVar107);
            auVar107 = vmulps_avx512vl(auVar107,auVar199);
            fVar165 = auVar101._0_4_;
            fVar147 = auVar101._4_4_;
            fVar164 = auVar101._8_4_;
            fVar172 = auVar101._12_4_;
            fVar173 = auVar101._16_4_;
            fVar174 = auVar101._20_4_;
            fVar157 = auVar101._24_4_;
            auVar49._4_4_ = fVar147 * fVar147 * fVar147 * auVar107._4_4_;
            auVar49._0_4_ = fVar165 * fVar165 * fVar165 * auVar107._0_4_;
            auVar49._8_4_ = fVar164 * fVar164 * fVar164 * auVar107._8_4_;
            auVar49._12_4_ = fVar172 * fVar172 * fVar172 * auVar107._12_4_;
            auVar49._16_4_ = fVar173 * fVar173 * fVar173 * auVar107._16_4_;
            auVar49._20_4_ = fVar174 * fVar174 * fVar174 * auVar107._20_4_;
            auVar49._24_4_ = fVar157 * fVar157 * fVar157 * auVar107._24_4_;
            auVar49._28_4_ = auVar107._28_4_;
            auVar107 = vfmadd231ps_avx512vl(auVar49,auVar103,auVar101);
            auVar50._4_4_ = auVar119._4_4_ * auVar107._4_4_;
            auVar50._0_4_ = auVar119._0_4_ * auVar107._0_4_;
            auVar50._8_4_ = auVar119._8_4_ * auVar107._8_4_;
            auVar50._12_4_ = auVar119._12_4_ * auVar107._12_4_;
            auVar50._16_4_ = auVar119._16_4_ * auVar107._16_4_;
            auVar50._20_4_ = auVar119._20_4_ * auVar107._20_4_;
            auVar50._24_4_ = auVar119._24_4_ * auVar107._24_4_;
            auVar50._28_4_ = auVar101._28_4_;
            auVar51._4_4_ = auVar107._4_4_ * auVar105._4_4_;
            auVar51._0_4_ = auVar107._0_4_ * auVar105._0_4_;
            auVar51._8_4_ = auVar107._8_4_ * auVar105._8_4_;
            auVar51._12_4_ = auVar107._12_4_ * auVar105._12_4_;
            auVar51._16_4_ = auVar107._16_4_ * auVar105._16_4_;
            auVar51._20_4_ = auVar107._20_4_ * auVar105._20_4_;
            auVar51._24_4_ = auVar107._24_4_ * auVar105._24_4_;
            auVar51._28_4_ = auVar105._28_4_;
            auVar105 = vmulps_avx512vl(auVar107,auVar99);
            auVar86 = vfmadd213ps_fma(auVar47,ZEXT1632(auVar85),auVar94);
            auVar107 = ZEXT1632(auVar85);
            auVar18 = vfmadd213ps_fma(auVar48,auVar107,auVar96);
            auVar103 = vfmadd213ps_avx512vl(auVar102,auVar107,auVar91);
            auVar101 = vfmadd213ps_avx512vl(auVar50,ZEXT1632(auVar84),auVar97);
            auVar23 = vfnmadd213ps_fma(auVar47,auVar107,auVar94);
            auVar92 = ZEXT1632(auVar84);
            auVar19 = vfmadd213ps_fma(auVar51,auVar92,auVar98);
            auVar87 = vfnmadd213ps_fma(auVar48,auVar107,auVar96);
            auVar20 = vfmadd213ps_fma(auVar105,auVar92,auVar90);
            auVar96 = ZEXT1632(auVar85);
            auVar89 = vfnmadd231ps_fma(auVar91,auVar96,auVar102);
            auVar88 = vfnmadd213ps_fma(auVar50,auVar92,auVar97);
            auVar27 = vfnmadd213ps_fma(auVar51,auVar92,auVar98);
            auVar28 = vfnmadd231ps_fma(auVar90,ZEXT1632(auVar84),auVar105);
            auVar90 = vsubps_avx512vl(auVar101,ZEXT1632(auVar23));
            auVar105 = vsubps_avx(ZEXT1632(auVar19),ZEXT1632(auVar87));
            auVar107 = vsubps_avx(ZEXT1632(auVar20),ZEXT1632(auVar89));
            auVar52._4_4_ = auVar105._4_4_ * auVar89._4_4_;
            auVar52._0_4_ = auVar105._0_4_ * auVar89._0_4_;
            auVar52._8_4_ = auVar105._8_4_ * auVar89._8_4_;
            auVar52._12_4_ = auVar105._12_4_ * auVar89._12_4_;
            auVar52._16_4_ = auVar105._16_4_ * 0.0;
            auVar52._20_4_ = auVar105._20_4_ * 0.0;
            auVar52._24_4_ = auVar105._24_4_ * 0.0;
            auVar52._28_4_ = auVar102._28_4_;
            auVar85 = vfmsub231ps_fma(auVar52,ZEXT1632(auVar87),auVar107);
            auVar53._4_4_ = auVar107._4_4_ * auVar23._4_4_;
            auVar53._0_4_ = auVar107._0_4_ * auVar23._0_4_;
            auVar53._8_4_ = auVar107._8_4_ * auVar23._8_4_;
            auVar53._12_4_ = auVar107._12_4_ * auVar23._12_4_;
            auVar53._16_4_ = auVar107._16_4_ * 0.0;
            auVar53._20_4_ = auVar107._20_4_ * 0.0;
            auVar53._24_4_ = auVar107._24_4_ * 0.0;
            auVar53._28_4_ = auVar107._28_4_;
            auVar21 = vfmsub231ps_fma(auVar53,ZEXT1632(auVar89),auVar90);
            auVar54._4_4_ = auVar87._4_4_ * auVar90._4_4_;
            auVar54._0_4_ = auVar87._0_4_ * auVar90._0_4_;
            auVar54._8_4_ = auVar87._8_4_ * auVar90._8_4_;
            auVar54._12_4_ = auVar87._12_4_ * auVar90._12_4_;
            auVar54._16_4_ = auVar90._16_4_ * 0.0;
            auVar54._20_4_ = auVar90._20_4_ * 0.0;
            auVar54._24_4_ = auVar90._24_4_ * 0.0;
            auVar54._28_4_ = auVar90._28_4_;
            auVar22 = vfmsub231ps_fma(auVar54,ZEXT1632(auVar23),auVar105);
            auVar105 = vfmadd231ps_avx512vl(ZEXT1632(auVar22),auVar99,ZEXT1632(auVar21));
            auVar105 = vfmadd231ps_avx512vl(auVar105,auVar99,ZEXT1632(auVar85));
            uVar69 = vcmpps_avx512vl(auVar105,auVar99,2);
            bVar71 = (byte)uVar69;
            fVar80 = (float)((uint)(bVar71 & 1) * auVar86._0_4_ |
                            (uint)!(bool)(bVar71 & 1) * auVar88._0_4_);
            bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
            fVar128 = (float)((uint)bVar12 * auVar86._4_4_ | (uint)!bVar12 * auVar88._4_4_);
            bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
            fVar130 = (float)((uint)bVar12 * auVar86._8_4_ | (uint)!bVar12 * auVar88._8_4_);
            bVar12 = (bool)((byte)(uVar69 >> 3) & 1);
            fVar132 = (float)((uint)bVar12 * auVar86._12_4_ | (uint)!bVar12 * auVar88._12_4_);
            auVar92 = ZEXT1632(CONCAT412(fVar132,CONCAT48(fVar130,CONCAT44(fVar128,fVar80))));
            fVar127 = (float)((uint)(bVar71 & 1) * auVar18._0_4_ |
                             (uint)!(bool)(bVar71 & 1) * auVar27._0_4_);
            bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
            fVar129 = (float)((uint)bVar12 * auVar18._4_4_ | (uint)!bVar12 * auVar27._4_4_);
            bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
            fVar131 = (float)((uint)bVar12 * auVar18._8_4_ | (uint)!bVar12 * auVar27._8_4_);
            bVar12 = (bool)((byte)(uVar69 >> 3) & 1);
            fVar133 = (float)((uint)bVar12 * auVar18._12_4_ | (uint)!bVar12 * auVar27._12_4_);
            auVar95 = ZEXT1632(CONCAT412(fVar133,CONCAT48(fVar131,CONCAT44(fVar129,fVar127))));
            auVar120._0_4_ =
                 (float)((uint)(bVar71 & 1) * auVar103._0_4_ |
                        (uint)!(bool)(bVar71 & 1) * auVar28._0_4_);
            bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
            auVar120._4_4_ = (float)((uint)bVar12 * auVar103._4_4_ | (uint)!bVar12 * auVar28._4_4_);
            bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
            auVar120._8_4_ = (float)((uint)bVar12 * auVar103._8_4_ | (uint)!bVar12 * auVar28._8_4_);
            bVar12 = (bool)((byte)(uVar69 >> 3) & 1);
            auVar120._12_4_ =
                 (float)((uint)bVar12 * auVar103._12_4_ | (uint)!bVar12 * auVar28._12_4_);
            fVar147 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar103._16_4_);
            auVar120._16_4_ = fVar147;
            fVar165 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar103._20_4_);
            auVar120._20_4_ = fVar165;
            fVar164 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar103._24_4_);
            auVar120._24_4_ = fVar164;
            iVar1 = (uint)(byte)(uVar69 >> 7) * auVar103._28_4_;
            auVar120._28_4_ = iVar1;
            auVar105 = vblendmps_avx512vl(ZEXT1632(auVar23),auVar101);
            auVar121._0_4_ =
                 (uint)(bVar71 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar85._0_4_;
            bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
            auVar121._4_4_ = (uint)bVar12 * auVar105._4_4_ | (uint)!bVar12 * auVar85._4_4_;
            bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
            auVar121._8_4_ = (uint)bVar12 * auVar105._8_4_ | (uint)!bVar12 * auVar85._8_4_;
            bVar12 = (bool)((byte)(uVar69 >> 3) & 1);
            auVar121._12_4_ = (uint)bVar12 * auVar105._12_4_ | (uint)!bVar12 * auVar85._12_4_;
            auVar121._16_4_ = (uint)((byte)(uVar69 >> 4) & 1) * auVar105._16_4_;
            auVar121._20_4_ = (uint)((byte)(uVar69 >> 5) & 1) * auVar105._20_4_;
            auVar121._24_4_ = (uint)((byte)(uVar69 >> 6) & 1) * auVar105._24_4_;
            auVar121._28_4_ = (uint)(byte)(uVar69 >> 7) * auVar105._28_4_;
            auVar105 = vblendmps_avx512vl(ZEXT1632(auVar87),ZEXT1632(auVar19));
            auVar122._0_4_ =
                 (float)((uint)(bVar71 & 1) * auVar105._0_4_ |
                        (uint)!(bool)(bVar71 & 1) * auVar86._0_4_);
            bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
            auVar122._4_4_ = (float)((uint)bVar12 * auVar105._4_4_ | (uint)!bVar12 * auVar86._4_4_);
            bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
            auVar122._8_4_ = (float)((uint)bVar12 * auVar105._8_4_ | (uint)!bVar12 * auVar86._8_4_);
            bVar12 = (bool)((byte)(uVar69 >> 3) & 1);
            auVar122._12_4_ =
                 (float)((uint)bVar12 * auVar105._12_4_ | (uint)!bVar12 * auVar86._12_4_);
            fVar173 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar105._16_4_);
            auVar122._16_4_ = fVar173;
            fVar172 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar105._20_4_);
            auVar122._20_4_ = fVar172;
            fVar174 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar105._24_4_);
            auVar122._24_4_ = fVar174;
            auVar122._28_4_ = (uint)(byte)(uVar69 >> 7) * auVar105._28_4_;
            auVar105 = vblendmps_avx512vl(ZEXT1632(auVar89),ZEXT1632(auVar20));
            auVar123._0_4_ =
                 (float)((uint)(bVar71 & 1) * auVar105._0_4_ |
                        (uint)!(bool)(bVar71 & 1) * auVar18._0_4_);
            bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
            auVar123._4_4_ = (float)((uint)bVar12 * auVar105._4_4_ | (uint)!bVar12 * auVar18._4_4_);
            bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
            auVar123._8_4_ = (float)((uint)bVar12 * auVar105._8_4_ | (uint)!bVar12 * auVar18._8_4_);
            bVar12 = (bool)((byte)(uVar69 >> 3) & 1);
            auVar123._12_4_ =
                 (float)((uint)bVar12 * auVar105._12_4_ | (uint)!bVar12 * auVar18._12_4_);
            fVar157 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar105._16_4_);
            auVar123._16_4_ = fVar157;
            fVar163 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar105._20_4_);
            auVar123._20_4_ = fVar163;
            fVar79 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar105._24_4_);
            auVar123._24_4_ = fVar79;
            iVar2 = (uint)(byte)(uVar69 >> 7) * auVar105._28_4_;
            auVar123._28_4_ = iVar2;
            auVar124._0_4_ =
                 (uint)(bVar71 & 1) * (int)auVar23._0_4_ |
                 (uint)!(bool)(bVar71 & 1) * auVar101._0_4_;
            bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
            auVar124._4_4_ = (uint)bVar12 * (int)auVar23._4_4_ | (uint)!bVar12 * auVar101._4_4_;
            bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
            auVar124._8_4_ = (uint)bVar12 * (int)auVar23._8_4_ | (uint)!bVar12 * auVar101._8_4_;
            bVar12 = (bool)((byte)(uVar69 >> 3) & 1);
            auVar124._12_4_ = (uint)bVar12 * (int)auVar23._12_4_ | (uint)!bVar12 * auVar101._12_4_;
            auVar124._16_4_ = (uint)!(bool)((byte)(uVar69 >> 4) & 1) * auVar101._16_4_;
            auVar124._20_4_ = (uint)!(bool)((byte)(uVar69 >> 5) & 1) * auVar101._20_4_;
            auVar124._24_4_ = (uint)!(bool)((byte)(uVar69 >> 6) & 1) * auVar101._24_4_;
            auVar124._28_4_ = (uint)!SUB81(uVar69 >> 7,0) * auVar101._28_4_;
            bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar69 >> 2) & 1);
            bVar16 = (bool)((byte)(uVar69 >> 3) & 1);
            bVar13 = (bool)((byte)(uVar69 >> 1) & 1);
            bVar14 = (bool)((byte)(uVar69 >> 2) & 1);
            bVar17 = (bool)((byte)(uVar69 >> 3) & 1);
            auVar101 = vsubps_avx512vl(auVar124,auVar92);
            auVar107 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar87._12_4_ |
                                                     (uint)!bVar16 * auVar19._12_4_,
                                                     CONCAT48((uint)bVar15 * (int)auVar87._8_4_ |
                                                              (uint)!bVar15 * auVar19._8_4_,
                                                              CONCAT44((uint)bVar12 *
                                                                       (int)auVar87._4_4_ |
                                                                       (uint)!bVar12 * auVar19._4_4_
                                                                       ,(uint)(bVar71 & 1) *
                                                                        (int)auVar87._0_4_ |
                                                                        (uint)!(bool)(bVar71 & 1) *
                                                                        auVar19._0_4_)))),auVar95);
            auVar103 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar89._12_4_ |
                                                     (uint)!bVar17 * auVar20._12_4_,
                                                     CONCAT48((uint)bVar14 * (int)auVar89._8_4_ |
                                                              (uint)!bVar14 * auVar20._8_4_,
                                                              CONCAT44((uint)bVar13 *
                                                                       (int)auVar89._4_4_ |
                                                                       (uint)!bVar13 * auVar20._4_4_
                                                                       ,(uint)(bVar71 & 1) *
                                                                        (int)auVar89._0_4_ |
                                                                        (uint)!(bool)(bVar71 & 1) *
                                                                        auVar20._0_4_)))),auVar120);
            auVar102 = vsubps_avx(auVar92,auVar121);
            auVar90 = vsubps_avx(auVar95,auVar122);
            auVar91 = vsubps_avx(auVar120,auVar123);
            auVar55._4_4_ = auVar103._4_4_ * fVar128;
            auVar55._0_4_ = auVar103._0_4_ * fVar80;
            auVar55._8_4_ = auVar103._8_4_ * fVar130;
            auVar55._12_4_ = auVar103._12_4_ * fVar132;
            auVar55._16_4_ = auVar103._16_4_ * 0.0;
            auVar55._20_4_ = auVar103._20_4_ * 0.0;
            auVar55._24_4_ = auVar103._24_4_ * 0.0;
            auVar55._28_4_ = 0;
            auVar85 = vfmsub231ps_fma(auVar55,auVar120,auVar101);
            auVar162._0_4_ = fVar127 * auVar101._0_4_;
            auVar162._4_4_ = fVar129 * auVar101._4_4_;
            auVar162._8_4_ = fVar131 * auVar101._8_4_;
            auVar162._12_4_ = fVar133 * auVar101._12_4_;
            auVar162._16_4_ = auVar101._16_4_ * 0.0;
            auVar162._20_4_ = auVar101._20_4_ * 0.0;
            auVar162._24_4_ = auVar101._24_4_ * 0.0;
            auVar162._28_4_ = 0;
            auVar86 = vfmsub231ps_fma(auVar162,auVar92,auVar107);
            auVar105 = vfmadd231ps_avx512vl(ZEXT1632(auVar86),auVar99,ZEXT1632(auVar85));
            auVar170._0_4_ = auVar107._0_4_ * auVar120._0_4_;
            auVar170._4_4_ = auVar107._4_4_ * auVar120._4_4_;
            auVar170._8_4_ = auVar107._8_4_ * auVar120._8_4_;
            auVar170._12_4_ = auVar107._12_4_ * auVar120._12_4_;
            auVar170._16_4_ = auVar107._16_4_ * fVar147;
            auVar170._20_4_ = auVar107._20_4_ * fVar165;
            auVar170._24_4_ = auVar107._24_4_ * fVar164;
            auVar170._28_4_ = 0;
            auVar85 = vfmsub231ps_fma(auVar170,auVar95,auVar103);
            auVar93 = vfmadd231ps_avx512vl(auVar105,auVar99,ZEXT1632(auVar85));
            auVar105 = vmulps_avx512vl(auVar91,auVar121);
            auVar105 = vfmsub231ps_avx512vl(auVar105,auVar102,auVar123);
            auVar56._4_4_ = auVar90._4_4_ * auVar123._4_4_;
            auVar56._0_4_ = auVar90._0_4_ * auVar123._0_4_;
            auVar56._8_4_ = auVar90._8_4_ * auVar123._8_4_;
            auVar56._12_4_ = auVar90._12_4_ * auVar123._12_4_;
            auVar56._16_4_ = auVar90._16_4_ * fVar157;
            auVar56._20_4_ = auVar90._20_4_ * fVar163;
            auVar56._24_4_ = auVar90._24_4_ * fVar79;
            auVar56._28_4_ = iVar2;
            auVar85 = vfmsub231ps_fma(auVar56,auVar122,auVar91);
            auVar171._0_4_ = auVar122._0_4_ * auVar102._0_4_;
            auVar171._4_4_ = auVar122._4_4_ * auVar102._4_4_;
            auVar171._8_4_ = auVar122._8_4_ * auVar102._8_4_;
            auVar171._12_4_ = auVar122._12_4_ * auVar102._12_4_;
            auVar171._16_4_ = fVar173 * auVar102._16_4_;
            auVar171._20_4_ = fVar172 * auVar102._20_4_;
            auVar171._24_4_ = fVar174 * auVar102._24_4_;
            auVar171._28_4_ = 0;
            auVar86 = vfmsub231ps_fma(auVar171,auVar90,auVar121);
            auVar105 = vfmadd231ps_avx512vl(ZEXT1632(auVar86),auVar99,auVar105);
            auVar94 = vfmadd231ps_avx512vl(auVar105,auVar99,ZEXT1632(auVar85));
            auVar105 = vmaxps_avx(auVar93,auVar94);
            uVar135 = vcmpps_avx512vl(auVar105,auVar99,2);
            local_630 = local_630 & (byte)uVar135;
            if (local_630 == 0) {
LAB_01c1b1e4:
              local_630 = 0;
            }
            else {
              auVar57._4_4_ = auVar91._4_4_ * auVar107._4_4_;
              auVar57._0_4_ = auVar91._0_4_ * auVar107._0_4_;
              auVar57._8_4_ = auVar91._8_4_ * auVar107._8_4_;
              auVar57._12_4_ = auVar91._12_4_ * auVar107._12_4_;
              auVar57._16_4_ = auVar91._16_4_ * auVar107._16_4_;
              auVar57._20_4_ = auVar91._20_4_ * auVar107._20_4_;
              auVar57._24_4_ = auVar91._24_4_ * auVar107._24_4_;
              auVar57._28_4_ = auVar105._28_4_;
              auVar18 = vfmsub231ps_fma(auVar57,auVar90,auVar103);
              auVar58._4_4_ = auVar103._4_4_ * auVar102._4_4_;
              auVar58._0_4_ = auVar103._0_4_ * auVar102._0_4_;
              auVar58._8_4_ = auVar103._8_4_ * auVar102._8_4_;
              auVar58._12_4_ = auVar103._12_4_ * auVar102._12_4_;
              auVar58._16_4_ = auVar103._16_4_ * auVar102._16_4_;
              auVar58._20_4_ = auVar103._20_4_ * auVar102._20_4_;
              auVar58._24_4_ = auVar103._24_4_ * auVar102._24_4_;
              auVar58._28_4_ = auVar103._28_4_;
              auVar86 = vfmsub231ps_fma(auVar58,auVar101,auVar91);
              auVar59._4_4_ = auVar90._4_4_ * auVar101._4_4_;
              auVar59._0_4_ = auVar90._0_4_ * auVar101._0_4_;
              auVar59._8_4_ = auVar90._8_4_ * auVar101._8_4_;
              auVar59._12_4_ = auVar90._12_4_ * auVar101._12_4_;
              auVar59._16_4_ = auVar90._16_4_ * auVar101._16_4_;
              auVar59._20_4_ = auVar90._20_4_ * auVar101._20_4_;
              auVar59._24_4_ = auVar90._24_4_ * auVar101._24_4_;
              auVar59._28_4_ = auVar90._28_4_;
              auVar19 = vfmsub231ps_fma(auVar59,auVar102,auVar107);
              auVar85 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar86),ZEXT1632(auVar19));
              auVar105 = vfmadd231ps_avx512vl(ZEXT1632(auVar85),ZEXT1632(auVar18),auVar99);
              auVar107 = vrcp14ps_avx512vl(auVar105);
              auVar34._8_4_ = 0x3f800000;
              auVar34._0_8_ = &DAT_3f8000003f800000;
              auVar34._12_4_ = 0x3f800000;
              auVar34._16_4_ = 0x3f800000;
              auVar34._20_4_ = 0x3f800000;
              auVar34._24_4_ = 0x3f800000;
              auVar34._28_4_ = 0x3f800000;
              auVar103 = vfnmadd213ps_avx512vl(auVar107,auVar105,auVar34);
              auVar85 = vfmadd132ps_fma(auVar103,auVar107,auVar107);
              auVar60._4_4_ = auVar19._4_4_ * auVar120._4_4_;
              auVar60._0_4_ = auVar19._0_4_ * auVar120._0_4_;
              auVar60._8_4_ = auVar19._8_4_ * auVar120._8_4_;
              auVar60._12_4_ = auVar19._12_4_ * auVar120._12_4_;
              auVar60._16_4_ = fVar147 * 0.0;
              auVar60._20_4_ = fVar165 * 0.0;
              auVar60._24_4_ = fVar164 * 0.0;
              auVar60._28_4_ = iVar1;
              auVar86 = vfmadd231ps_fma(auVar60,auVar95,ZEXT1632(auVar86));
              auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar92,ZEXT1632(auVar18));
              fVar165 = auVar85._0_4_;
              fVar147 = auVar85._4_4_;
              fVar164 = auVar85._8_4_;
              fVar172 = auVar85._12_4_;
              auVar107 = ZEXT1632(CONCAT412(auVar86._12_4_ * fVar172,
                                            CONCAT48(auVar86._8_4_ * fVar164,
                                                     CONCAT44(auVar86._4_4_ * fVar147,
                                                              auVar86._0_4_ * fVar165))));
              auVar68._4_4_ = uStack_6fc;
              auVar68._0_4_ = local_700;
              auVar68._8_4_ = uStack_6f8;
              auVar68._12_4_ = uStack_6f4;
              auVar68._16_4_ = uStack_6f0;
              auVar68._20_4_ = uStack_6ec;
              auVar68._24_4_ = uStack_6e8;
              auVar68._28_4_ = uStack_6e4;
              uVar135 = vcmpps_avx512vl(auVar107,auVar68,0xd);
              uVar134 = *(undefined4 *)(ray + k * 4 + 0x200);
              auVar35._4_4_ = uVar134;
              auVar35._0_4_ = uVar134;
              auVar35._8_4_ = uVar134;
              auVar35._12_4_ = uVar134;
              auVar35._16_4_ = uVar134;
              auVar35._20_4_ = uVar134;
              auVar35._24_4_ = uVar134;
              auVar35._28_4_ = uVar134;
              uVar24 = vcmpps_avx512vl(auVar107,auVar35,2);
              local_630 = (byte)uVar135 & (byte)uVar24 & local_630;
              if (local_630 == 0) goto LAB_01c1b1e4;
              uVar135 = vcmpps_avx512vl(auVar105,auVar99,4);
              if ((local_630 & (byte)uVar135) == 0) {
                local_630 = 0;
              }
              else {
                local_630 = local_630 & (byte)uVar135;
                fVar173 = auVar93._0_4_ * fVar165;
                fVar174 = auVar93._4_4_ * fVar147;
                auVar61._4_4_ = fVar174;
                auVar61._0_4_ = fVar173;
                fVar157 = auVar93._8_4_ * fVar164;
                auVar61._8_4_ = fVar157;
                fVar163 = auVar93._12_4_ * fVar172;
                auVar61._12_4_ = fVar163;
                fVar79 = auVar93._16_4_ * 0.0;
                auVar61._16_4_ = fVar79;
                fVar80 = auVar93._20_4_ * 0.0;
                auVar61._20_4_ = fVar80;
                fVar127 = auVar93._24_4_ * 0.0;
                auVar61._24_4_ = fVar127;
                auVar61._28_4_ = auVar93._28_4_;
                fVar165 = auVar94._0_4_ * fVar165;
                fVar147 = auVar94._4_4_ * fVar147;
                auVar62._4_4_ = fVar147;
                auVar62._0_4_ = fVar165;
                fVar164 = auVar94._8_4_ * fVar164;
                auVar62._8_4_ = fVar164;
                fVar172 = auVar94._12_4_ * fVar172;
                auVar62._12_4_ = fVar172;
                fVar128 = auVar94._16_4_ * 0.0;
                auVar62._16_4_ = fVar128;
                fVar129 = auVar94._20_4_ * 0.0;
                auVar62._20_4_ = fVar129;
                fVar130 = auVar94._24_4_ * 0.0;
                auVar62._24_4_ = fVar130;
                auVar62._28_4_ = auVar94._28_4_;
                auVar181._8_4_ = 0x3f800000;
                auVar181._0_8_ = &DAT_3f8000003f800000;
                auVar181._12_4_ = 0x3f800000;
                auVar181._16_4_ = 0x3f800000;
                auVar181._20_4_ = 0x3f800000;
                auVar181._24_4_ = 0x3f800000;
                auVar181._28_4_ = 0x3f800000;
                auVar105 = vsubps_avx(auVar181,auVar61);
                local_880._0_4_ =
                     (uint)(bVar71 & 1) * (int)fVar173 | (uint)!(bool)(bVar71 & 1) * auVar105._0_4_;
                bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
                local_880._4_4_ = (uint)bVar12 * (int)fVar174 | (uint)!bVar12 * auVar105._4_4_;
                bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
                local_880._8_4_ = (uint)bVar12 * (int)fVar157 | (uint)!bVar12 * auVar105._8_4_;
                bVar12 = (bool)((byte)(uVar69 >> 3) & 1);
                local_880._12_4_ = (uint)bVar12 * (int)fVar163 | (uint)!bVar12 * auVar105._12_4_;
                bVar12 = (bool)((byte)(uVar69 >> 4) & 1);
                local_880._16_4_ = (uint)bVar12 * (int)fVar79 | (uint)!bVar12 * auVar105._16_4_;
                bVar12 = (bool)((byte)(uVar69 >> 5) & 1);
                local_880._20_4_ = (uint)bVar12 * (int)fVar80 | (uint)!bVar12 * auVar105._20_4_;
                bVar12 = (bool)((byte)(uVar69 >> 6) & 1);
                local_880._24_4_ = (uint)bVar12 * (int)fVar127 | (uint)!bVar12 * auVar105._24_4_;
                bVar12 = SUB81(uVar69 >> 7,0);
                local_880._28_4_ = (uint)bVar12 * auVar93._28_4_ | (uint)!bVar12 * auVar105._28_4_;
                auVar105 = vsubps_avx(auVar181,auVar62);
                local_560._0_4_ =
                     (uint)(bVar71 & 1) * (int)fVar165 | (uint)!(bool)(bVar71 & 1) * auVar105._0_4_;
                bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
                local_560._4_4_ = (uint)bVar12 * (int)fVar147 | (uint)!bVar12 * auVar105._4_4_;
                bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
                local_560._8_4_ = (uint)bVar12 * (int)fVar164 | (uint)!bVar12 * auVar105._8_4_;
                bVar12 = (bool)((byte)(uVar69 >> 3) & 1);
                local_560._12_4_ = (uint)bVar12 * (int)fVar172 | (uint)!bVar12 * auVar105._12_4_;
                bVar12 = (bool)((byte)(uVar69 >> 4) & 1);
                local_560._16_4_ = (uint)bVar12 * (int)fVar128 | (uint)!bVar12 * auVar105._16_4_;
                bVar12 = (bool)((byte)(uVar69 >> 5) & 1);
                local_560._20_4_ = (uint)bVar12 * (int)fVar129 | (uint)!bVar12 * auVar105._20_4_;
                bVar12 = (bool)((byte)(uVar69 >> 6) & 1);
                local_560._24_4_ = (uint)bVar12 * (int)fVar130 | (uint)!bVar12 * auVar105._24_4_;
                bVar12 = SUB81(uVar69 >> 7,0);
                local_560._28_4_ = (uint)bVar12 * auVar94._28_4_ | (uint)!bVar12 * auVar105._28_4_;
                local_8a0 = auVar107;
              }
            }
            auVar208 = ZEXT3264(local_920);
            auVar196 = ZEXT3264(local_900);
            if (local_630 != 0) {
              auVar105 = vsubps_avx(ZEXT1632(auVar84),auVar96);
              auVar85 = vfmadd213ps_fma(auVar105,local_880,auVar96);
              uVar134 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
              auVar36._4_4_ = uVar134;
              auVar36._0_4_ = uVar134;
              auVar36._8_4_ = uVar134;
              auVar36._12_4_ = uVar134;
              auVar36._16_4_ = uVar134;
              auVar36._20_4_ = uVar134;
              auVar36._24_4_ = uVar134;
              auVar36._28_4_ = uVar134;
              auVar105 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar85._12_4_ + auVar85._12_4_,
                                                            CONCAT48(auVar85._8_4_ + auVar85._8_4_,
                                                                     CONCAT44(auVar85._4_4_ +
                                                                              auVar85._4_4_,
                                                                              auVar85._0_4_ +
                                                                              auVar85._0_4_)))),
                                         auVar36);
              uVar135 = vcmpps_avx512vl(local_8a0,auVar105,6);
              local_630 = local_630 & (byte)uVar135;
              if (local_630 != 0) {
                auVar145._8_4_ = 0xbf800000;
                auVar145._0_8_ = 0xbf800000bf800000;
                auVar145._12_4_ = 0xbf800000;
                auVar145._16_4_ = 0xbf800000;
                auVar145._20_4_ = 0xbf800000;
                auVar145._24_4_ = 0xbf800000;
                auVar145._28_4_ = 0xbf800000;
                auVar37._8_4_ = 0x40000000;
                auVar37._0_8_ = 0x4000000040000000;
                auVar37._12_4_ = 0x40000000;
                auVar37._16_4_ = 0x40000000;
                auVar37._20_4_ = 0x40000000;
                auVar37._24_4_ = 0x40000000;
                auVar37._28_4_ = 0x40000000;
                local_6c0 = vfmadd132ps_avx512vl(local_560,auVar145,auVar37);
                local_560 = local_6c0;
                auVar105 = local_560;
                local_680 = (undefined4)lVar77;
                local_670 = local_970._0_8_;
                uStack_668 = local_970._8_8_;
                local_660 = local_750._0_8_;
                uStack_658 = local_750._8_8_;
                local_650 = local_760._0_8_;
                uStack_648 = local_760._8_8_;
                local_640 = local_770._0_8_;
                uStack_638 = local_770._8_8_;
                pGVar8 = (context->scene->geometries).items[uVar76].ptr;
                if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) {
                  bVar71 = 0;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (bVar71 = 1, pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_400 = vmovdqa64_avx512vl(auVar200._0_32_);
                  auVar85 = vcvtsi2ss_avx512f(auVar201._0_16_,local_680);
                  fVar165 = auVar85._0_4_;
                  local_620[0] = (fVar165 + local_880._0_4_ + 0.0) * (float)local_720;
                  local_620[1] = (fVar165 + local_880._4_4_ + 1.0) * local_720._4_4_;
                  local_620[2] = (fVar165 + local_880._8_4_ + 2.0) * fStack_718;
                  local_620[3] = (fVar165 + local_880._12_4_ + 3.0) * fStack_714;
                  fStack_610 = (fVar165 + local_880._16_4_ + 4.0) * fStack_710;
                  fStack_60c = (fVar165 + local_880._20_4_ + 5.0) * fStack_70c;
                  fStack_608 = (fVar165 + local_880._24_4_ + 6.0) * fStack_708;
                  fStack_604 = fVar165 + local_880._28_4_ + 7.0;
                  local_560._0_8_ = local_6c0._0_8_;
                  local_560._8_8_ = local_6c0._8_8_;
                  local_560._16_8_ = local_6c0._16_8_;
                  local_560._24_8_ = local_6c0._24_8_;
                  local_600 = local_560._0_8_;
                  uStack_5f8 = local_560._8_8_;
                  uStack_5f0 = local_560._16_8_;
                  uStack_5e8 = local_560._24_8_;
                  local_5e0 = local_8a0;
                  local_8c0 = local_750._0_8_;
                  uStack_8b8 = local_750._8_8_;
                  uVar69 = 0;
                  uVar72 = (ulong)local_630;
                  for (uVar74 = uVar72; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x8000000000000000
                      ) {
                    uVar69 = uVar69 + 1;
                  }
                  local_8d0 = local_760._0_4_;
                  fStack_8cc = local_760._4_4_;
                  fStack_8c8 = local_760._8_4_;
                  fStack_8c4 = local_760._12_4_;
                  _local_990 = local_770;
                  local_500._0_4_ = 1;
                  local_6e0 = local_880;
                  local_6a0 = local_8a0;
                  local_67c = iVar7;
                  local_560 = auVar105;
                  do {
                    local_980 = *(undefined4 *)(ray + k * 4 + 0x200);
                    local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_620[uVar69]));
                    local_1c0 = vbroadcastss_avx512f
                                          (ZEXT416(*(uint *)((long)&local_600 + uVar69 * 4)));
                    *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_5e0 + uVar69 * 4);
                    local_9c0.context = context->user;
                    fVar172 = local_200._0_4_;
                    fVar147 = 1.0 - fVar172;
                    fVar165 = fVar147 * fVar147 * -3.0;
                    auVar85 = vfmadd231ss_fma(ZEXT416((uint)(fVar147 * fVar147)),
                                              ZEXT416((uint)(fVar172 * fVar147)),ZEXT416(0xc0000000)
                                             );
                    auVar84 = vfmsub132ss_fma(ZEXT416((uint)(fVar172 * fVar147)),
                                              ZEXT416((uint)(fVar172 * fVar172)),ZEXT416(0x40000000)
                                             );
                    fVar147 = auVar85._0_4_ * 3.0;
                    fVar164 = auVar84._0_4_ * 3.0;
                    fVar172 = fVar172 * fVar172 * 3.0;
                    auVar179._0_4_ = fVar172 * (float)local_990._0_4_;
                    auVar179._4_4_ = fVar172 * (float)local_990._4_4_;
                    auVar179._8_4_ = fVar172 * fStack_988;
                    auVar179._12_4_ = fVar172 * fStack_984;
                    auVar142._4_4_ = fVar164;
                    auVar142._0_4_ = fVar164;
                    auVar142._8_4_ = fVar164;
                    auVar142._12_4_ = fVar164;
                    auVar64._4_4_ = fStack_8cc;
                    auVar64._0_4_ = local_8d0;
                    auVar64._8_4_ = fStack_8c8;
                    auVar64._12_4_ = fStack_8c4;
                    auVar85 = vfmadd132ps_fma(auVar142,auVar179,auVar64);
                    auVar161._4_4_ = fVar147;
                    auVar161._0_4_ = fVar147;
                    auVar161._8_4_ = fVar147;
                    auVar161._12_4_ = fVar147;
                    auVar66._8_8_ = uStack_8b8;
                    auVar66._0_8_ = local_8c0;
                    auVar85 = vfmadd132ps_fma(auVar161,auVar85,auVar66);
                    auVar143._4_4_ = fVar165;
                    auVar143._0_4_ = fVar165;
                    auVar143._8_4_ = fVar165;
                    auVar143._12_4_ = fVar165;
                    auVar85 = vfmadd132ps_fma(auVar143,auVar85,local_970);
                    auVar146 = vbroadcastss_avx512f(auVar85);
                    auVar207 = vbroadcastss_avx512f(ZEXT416(1));
                    local_280 = vpermps_avx512f(auVar207,ZEXT1664(auVar85));
                    auVar207 = vbroadcastss_avx512f(ZEXT416(2));
                    local_240 = vpermps_avx512f(auVar207,ZEXT1664(auVar85));
                    local_2c0[0] = (RTCHitN)auVar146[0];
                    local_2c0[1] = (RTCHitN)auVar146[1];
                    local_2c0[2] = (RTCHitN)auVar146[2];
                    local_2c0[3] = (RTCHitN)auVar146[3];
                    local_2c0[4] = (RTCHitN)auVar146[4];
                    local_2c0[5] = (RTCHitN)auVar146[5];
                    local_2c0[6] = (RTCHitN)auVar146[6];
                    local_2c0[7] = (RTCHitN)auVar146[7];
                    local_2c0[8] = (RTCHitN)auVar146[8];
                    local_2c0[9] = (RTCHitN)auVar146[9];
                    local_2c0[10] = (RTCHitN)auVar146[10];
                    local_2c0[0xb] = (RTCHitN)auVar146[0xb];
                    local_2c0[0xc] = (RTCHitN)auVar146[0xc];
                    local_2c0[0xd] = (RTCHitN)auVar146[0xd];
                    local_2c0[0xe] = (RTCHitN)auVar146[0xe];
                    local_2c0[0xf] = (RTCHitN)auVar146[0xf];
                    local_2c0[0x10] = (RTCHitN)auVar146[0x10];
                    local_2c0[0x11] = (RTCHitN)auVar146[0x11];
                    local_2c0[0x12] = (RTCHitN)auVar146[0x12];
                    local_2c0[0x13] = (RTCHitN)auVar146[0x13];
                    local_2c0[0x14] = (RTCHitN)auVar146[0x14];
                    local_2c0[0x15] = (RTCHitN)auVar146[0x15];
                    local_2c0[0x16] = (RTCHitN)auVar146[0x16];
                    local_2c0[0x17] = (RTCHitN)auVar146[0x17];
                    local_2c0[0x18] = (RTCHitN)auVar146[0x18];
                    local_2c0[0x19] = (RTCHitN)auVar146[0x19];
                    local_2c0[0x1a] = (RTCHitN)auVar146[0x1a];
                    local_2c0[0x1b] = (RTCHitN)auVar146[0x1b];
                    local_2c0[0x1c] = (RTCHitN)auVar146[0x1c];
                    local_2c0[0x1d] = (RTCHitN)auVar146[0x1d];
                    local_2c0[0x1e] = (RTCHitN)auVar146[0x1e];
                    local_2c0[0x1f] = (RTCHitN)auVar146[0x1f];
                    local_2c0[0x20] = (RTCHitN)auVar146[0x20];
                    local_2c0[0x21] = (RTCHitN)auVar146[0x21];
                    local_2c0[0x22] = (RTCHitN)auVar146[0x22];
                    local_2c0[0x23] = (RTCHitN)auVar146[0x23];
                    local_2c0[0x24] = (RTCHitN)auVar146[0x24];
                    local_2c0[0x25] = (RTCHitN)auVar146[0x25];
                    local_2c0[0x26] = (RTCHitN)auVar146[0x26];
                    local_2c0[0x27] = (RTCHitN)auVar146[0x27];
                    local_2c0[0x28] = (RTCHitN)auVar146[0x28];
                    local_2c0[0x29] = (RTCHitN)auVar146[0x29];
                    local_2c0[0x2a] = (RTCHitN)auVar146[0x2a];
                    local_2c0[0x2b] = (RTCHitN)auVar146[0x2b];
                    local_2c0[0x2c] = (RTCHitN)auVar146[0x2c];
                    local_2c0[0x2d] = (RTCHitN)auVar146[0x2d];
                    local_2c0[0x2e] = (RTCHitN)auVar146[0x2e];
                    local_2c0[0x2f] = (RTCHitN)auVar146[0x2f];
                    local_2c0[0x30] = (RTCHitN)auVar146[0x30];
                    local_2c0[0x31] = (RTCHitN)auVar146[0x31];
                    local_2c0[0x32] = (RTCHitN)auVar146[0x32];
                    local_2c0[0x33] = (RTCHitN)auVar146[0x33];
                    local_2c0[0x34] = (RTCHitN)auVar146[0x34];
                    local_2c0[0x35] = (RTCHitN)auVar146[0x35];
                    local_2c0[0x36] = (RTCHitN)auVar146[0x36];
                    local_2c0[0x37] = (RTCHitN)auVar146[0x37];
                    local_2c0[0x38] = (RTCHitN)auVar146[0x38];
                    local_2c0[0x39] = (RTCHitN)auVar146[0x39];
                    local_2c0[0x3a] = (RTCHitN)auVar146[0x3a];
                    local_2c0[0x3b] = (RTCHitN)auVar146[0x3b];
                    local_2c0[0x3c] = (RTCHitN)auVar146[0x3c];
                    local_2c0[0x3d] = (RTCHitN)auVar146[0x3d];
                    local_2c0[0x3e] = (RTCHitN)auVar146[0x3e];
                    local_2c0[0x3f] = (RTCHitN)auVar146[0x3f];
                    local_180 = local_440._0_8_;
                    uStack_178 = local_440._8_8_;
                    uStack_170 = local_440._16_8_;
                    uStack_168 = local_440._24_8_;
                    uStack_160 = local_440._32_8_;
                    uStack_158 = local_440._40_8_;
                    uStack_150 = local_440._48_8_;
                    uStack_148 = local_440._56_8_;
                    auVar146 = vmovdqa64_avx512f(local_480);
                    local_140 = vmovdqa64_avx512f(auVar146);
                    vpcmpeqd_avx2(auVar146._0_32_,auVar146._0_32_);
                    local_100 = vbroadcastss_avx512f(ZEXT416((local_9c0.context)->instID[0]));
                    local_c0 = vbroadcastss_avx512f(ZEXT416((local_9c0.context)->instPrimID[0]));
                    local_5c0 = local_300;
                    local_9c0.valid = (int *)local_5c0;
                    local_9c0.geometryUserPtr = pGVar8->userPtr;
                    local_9c0.hit = local_2c0;
                    local_9c0.N = 0x10;
                    pRVar70 = (RayK<16> *)pGVar8->occlusionFilterN;
                    local_4c0._0_8_ = uVar69;
                    uVar74 = uVar69;
                    local_9c0.ray = (RTCRayN *)ray;
                    if (pRVar70 != (RayK<16> *)0x0) {
                      pRVar70 = (RayK<16> *)(*(code *)pRVar70)(&local_9c0);
                      uVar74 = local_4c0._0_8_;
                    }
                    auVar146 = vmovdqa64_avx512f(local_5c0);
                    uVar135 = vptestmd_avx512f(auVar146,auVar146);
                    if ((short)uVar135 != 0) {
                      p_Var11 = context->args->filter;
                      if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var11)(&local_9c0);
                        uVar74 = local_4c0._0_8_;
                      }
                      auVar85 = auVar205._0_16_;
                      auVar146 = vmovdqa64_avx512f(local_5c0);
                      uVar69 = vptestmd_avx512f(auVar146,auVar146);
                      auVar146 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                      bVar12 = (bool)((byte)uVar69 & 1);
                      auVar207._0_4_ =
                           (uint)bVar12 * auVar146._0_4_ |
                           (uint)!bVar12 * *(int *)(local_9c0.ray + 0x200);
                      bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
                      auVar207._4_4_ =
                           (uint)bVar12 * auVar146._4_4_ |
                           (uint)!bVar12 * *(int *)(local_9c0.ray + 0x204);
                      bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
                      auVar207._8_4_ =
                           (uint)bVar12 * auVar146._8_4_ |
                           (uint)!bVar12 * *(int *)(local_9c0.ray + 0x208);
                      bVar12 = (bool)((byte)(uVar69 >> 3) & 1);
                      auVar207._12_4_ =
                           (uint)bVar12 * auVar146._12_4_ |
                           (uint)!bVar12 * *(int *)(local_9c0.ray + 0x20c);
                      bVar12 = (bool)((byte)(uVar69 >> 4) & 1);
                      auVar207._16_4_ =
                           (uint)bVar12 * auVar146._16_4_ |
                           (uint)!bVar12 * *(int *)(local_9c0.ray + 0x210);
                      bVar12 = (bool)((byte)(uVar69 >> 5) & 1);
                      auVar207._20_4_ =
                           (uint)bVar12 * auVar146._20_4_ |
                           (uint)!bVar12 * *(int *)(local_9c0.ray + 0x214);
                      bVar12 = (bool)((byte)(uVar69 >> 6) & 1);
                      auVar207._24_4_ =
                           (uint)bVar12 * auVar146._24_4_ |
                           (uint)!bVar12 * *(int *)(local_9c0.ray + 0x218);
                      bVar12 = (bool)((byte)(uVar69 >> 7) & 1);
                      auVar207._28_4_ =
                           (uint)bVar12 * auVar146._28_4_ |
                           (uint)!bVar12 * *(int *)(local_9c0.ray + 0x21c);
                      bVar12 = (bool)((byte)(uVar69 >> 8) & 1);
                      auVar207._32_4_ =
                           (uint)bVar12 * auVar146._32_4_ |
                           (uint)!bVar12 * *(int *)(local_9c0.ray + 0x220);
                      bVar12 = (bool)((byte)(uVar69 >> 9) & 1);
                      auVar207._36_4_ =
                           (uint)bVar12 * auVar146._36_4_ |
                           (uint)!bVar12 * *(int *)(local_9c0.ray + 0x224);
                      bVar12 = (bool)((byte)(uVar69 >> 10) & 1);
                      auVar207._40_4_ =
                           (uint)bVar12 * auVar146._40_4_ |
                           (uint)!bVar12 * *(int *)(local_9c0.ray + 0x228);
                      bVar12 = (bool)((byte)(uVar69 >> 0xb) & 1);
                      auVar207._44_4_ =
                           (uint)bVar12 * auVar146._44_4_ |
                           (uint)!bVar12 * *(int *)(local_9c0.ray + 0x22c);
                      bVar12 = (bool)((byte)(uVar69 >> 0xc) & 1);
                      auVar207._48_4_ =
                           (uint)bVar12 * auVar146._48_4_ |
                           (uint)!bVar12 * *(int *)(local_9c0.ray + 0x230);
                      bVar12 = (bool)((byte)(uVar69 >> 0xd) & 1);
                      auVar207._52_4_ =
                           (uint)bVar12 * auVar146._52_4_ |
                           (uint)!bVar12 * *(int *)(local_9c0.ray + 0x234);
                      bVar12 = (bool)((byte)(uVar69 >> 0xe) & 1);
                      auVar207._56_4_ =
                           (uint)bVar12 * auVar146._56_4_ |
                           (uint)!bVar12 * *(int *)(local_9c0.ray + 0x238);
                      bVar12 = SUB81(uVar69 >> 0xf,0);
                      auVar207._60_4_ =
                           (uint)bVar12 * auVar146._60_4_ |
                           (uint)!bVar12 * *(int *)(local_9c0.ray + 0x23c);
                      *(undefined1 (*) [64])(local_9c0.ray + 0x200) = auVar207;
                      pRVar70 = (RayK<16> *)local_9c0.ray;
                      if ((short)uVar69 != 0) break;
                    }
                    auVar85 = auVar205._0_16_;
                    *(undefined4 *)(ray + k * 4 + 0x200) = local_980;
                    uVar69 = 0;
                    uVar72 = uVar72 ^ 1L << (uVar74 & 0x3f);
                    for (uVar74 = uVar72; (uVar74 & 1) == 0;
                        uVar74 = uVar74 >> 1 | 0x8000000000000000) {
                      uVar69 = uVar69 + 1;
                    }
                    local_500._0_4_ = (int)CONCAT71((int7)((ulong)pRVar70 >> 8),uVar72 != 0);
                  } while (uVar72 != 0);
                  bVar71 = local_500[0] & 1;
                  auVar85 = vxorps_avx512vl(auVar85,auVar85);
                  auVar205 = ZEXT1664(auVar85);
                  auVar202 = ZEXT3264(local_7a0);
                  auVar203 = ZEXT3264(local_740);
                  auVar204 = ZEXT3264(local_7c0);
                  auVar196 = ZEXT3264(local_900);
                  auVar208 = ZEXT3264(local_920);
                  auVar206 = ZEXT3264(local_800);
                  auVar146 = ZEXT3264(local_820);
                  auVar207 = ZEXT3264(local_840);
                  auVar105 = vmovdqa64_avx512vl(local_400);
                  auVar200 = ZEXT3264(auVar105);
                }
                bVar75 = (bool)(bVar75 | bVar71);
              }
            }
          }
          lVar77 = lVar77 + 8;
          auVar201 = auVar196;
        } while ((int)lVar77 < iVar7);
      }
      if (bVar75 != false) {
        return local_9f9;
      }
      uVar134 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar30._4_4_ = uVar134;
      auVar30._0_4_ = uVar134;
      auVar30._8_4_ = uVar134;
      auVar30._12_4_ = uVar134;
      uVar135 = vcmpps_avx512vl(local_510,auVar30,2);
      uVar76 = (uint)uVar78 & (uint)uVar78 + 0xf & (uint)uVar135;
      uVar78 = (ulong)uVar76;
      local_9f9 = uVar76 != 0;
    } while (local_9f9);
  }
  return local_9f9;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }